

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  int iVar7;
  undefined4 uVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  float fVar20;
  ulong uVar21;
  undefined8 uVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  float fVar54;
  float fVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  undefined1 auVar61 [32];
  float fVar62;
  byte bVar63;
  ulong uVar64;
  uint uVar65;
  long lVar66;
  long lVar67;
  Geometry *pGVar68;
  long lVar69;
  long lVar70;
  uint uVar71;
  byte bVar72;
  ulong uVar73;
  float fVar74;
  float fVar75;
  float fVar138;
  float fVar140;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar97 [16];
  float fVar144;
  float fVar145;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  vint4 bi_2;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined4 uVar158;
  undefined8 uVar159;
  vint4 bi_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  float fVar163;
  float fVar164;
  float fVar172;
  vint4 bi;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  vint4 ai;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  vint4 ai_1;
  undefined1 auVar205 [16];
  vint4 ai_2;
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  float fVar208;
  float fVar210;
  float fVar211;
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  RTCFilterFunctionNArguments args;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  RTCFilterFunctionNArguments local_670;
  undefined1 local_640 [16];
  Geometry *local_628;
  size_t local_620;
  undefined1 (*local_618) [32];
  Precalculations *local_610;
  ulong local_608;
  undefined1 local_600 [32];
  long local_5d8;
  LinearSpace3fa *local_5d0;
  ulong local_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined4 local_3e0;
  int local_3dc;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_380 [4];
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  
  uVar73 = (ulong)(byte)prim[1];
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 6)));
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xf + 6)));
  lVar69 = uVar73 * 0x25;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x11 + 6)));
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1a + 6)));
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1b + 6)));
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0x1c + 6)));
  uVar158 = *(undefined4 *)(prim + lVar69 + 0x12);
  auVar223._4_4_ = uVar158;
  auVar223._0_4_ = uVar158;
  auVar223._8_4_ = uVar158;
  auVar223._12_4_ = uVar158;
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar76 = vsubps_avx512vl(auVar89,*(undefined1 (*) [16])(prim + lVar69 + 6));
  fVar164 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar69 + 0x16)) *
            *(float *)(prim + lVar69 + 0x1a);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar95 = vpmovsxwd_avx(auVar89);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar73 * 0xb + 6);
  auVar226 = vpmovsxwd_avx(auVar92);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar73 * 9 + 6);
  auVar96 = vpmovsxwd_avx(auVar91);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar73 * 0xd + 6);
  auVar97 = vpmovsxwd_avx(auVar90);
  auVar77 = vpbroadcastd_avx512vl();
  auVar89 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar89 = vinsertps_avx512f(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar76 = vmulps_avx512vl(auVar223,auVar76);
  auVar78 = vmulps_avx512vl(auVar223,auVar89);
  auVar79 = vcvtdq2ps_avx512vl(auVar19);
  auVar80 = vcvtdq2ps_avx512vl(auVar85);
  auVar81 = vcvtdq2ps_avx512vl(auVar81);
  auVar82 = vcvtdq2ps_avx512vl(auVar82);
  auVar83 = vcvtdq2ps_avx512vl(auVar83);
  auVar89 = vcvtdq2ps_avx(auVar84);
  auVar92 = vcvtdq2ps_avx(auVar86);
  auVar91 = vcvtdq2ps_avx(auVar87);
  auVar90 = vcvtdq2ps_avx(auVar88);
  uVar158 = auVar78._0_4_;
  auVar214._4_4_ = uVar158;
  auVar214._0_4_ = uVar158;
  auVar214._8_4_ = uVar158;
  auVar214._12_4_ = uVar158;
  auVar19 = vshufps_avx(auVar78,auVar78,0x55);
  auVar85 = vshufps_avx(auVar78,auVar78,0xaa);
  auVar84 = vmulps_avx512vl(auVar85,auVar81);
  auVar160._0_4_ = auVar85._0_4_ * auVar89._0_4_;
  auVar160._4_4_ = auVar85._4_4_ * auVar89._4_4_;
  auVar160._8_4_ = auVar85._8_4_ * auVar89._8_4_;
  auVar160._12_4_ = auVar85._12_4_ * auVar89._12_4_;
  auVar78._0_4_ = auVar90._0_4_ * auVar85._0_4_;
  auVar78._4_4_ = auVar90._4_4_ * auVar85._4_4_;
  auVar78._8_4_ = auVar90._8_4_ * auVar85._8_4_;
  auVar78._12_4_ = auVar90._12_4_ * auVar85._12_4_;
  auVar85 = vfmadd231ps_avx512vl(auVar84,auVar19,auVar80);
  auVar84 = vfmadd231ps_avx512vl(auVar160,auVar19,auVar83);
  auVar19 = vfmadd231ps_fma(auVar78,auVar91,auVar19);
  auVar85 = vfmadd231ps_avx512vl(auVar85,auVar214,auVar79);
  auVar84 = vfmadd231ps_avx512vl(auVar84,auVar214,auVar82);
  auVar19 = vfmadd231ps_fma(auVar19,auVar92,auVar214);
  auVar86 = vbroadcastss_avx512vl(auVar76);
  auVar87 = vshufps_avx512vl(auVar76,auVar76,0x55);
  auVar88 = vshufps_avx512vl(auVar76,auVar76,0xaa);
  auVar81 = vmulps_avx512vl(auVar88,auVar81);
  auVar89 = vmulps_avx512vl(auVar88,auVar89);
  auVar90 = vmulps_avx512vl(auVar88,auVar90);
  auVar81 = vfmadd231ps_avx512vl(auVar81,auVar87,auVar80);
  auVar89 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar83);
  auVar91 = vfmadd231ps_avx512vl(auVar90,auVar87,auVar91);
  auVar79 = vfmadd231ps_avx512vl(auVar81,auVar86,auVar79);
  auVar80 = vfmadd231ps_avx512vl(auVar89,auVar86,auVar82);
  auVar78 = vfmadd231ps_fma(auVar91,auVar86,auVar92);
  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar227 = ZEXT1664(auVar89);
  auVar92 = vandps_avx512vl(auVar85,auVar89);
  auVar219._8_4_ = 0x219392ef;
  auVar219._0_8_ = 0x219392ef219392ef;
  auVar219._12_4_ = 0x219392ef;
  uVar64 = vcmpps_avx512vl(auVar92,auVar219,1);
  bVar12 = (bool)((byte)uVar64 & 1);
  auVar76._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar85._0_4_;
  bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar85._4_4_;
  bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar85._8_4_;
  bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar85._12_4_;
  auVar92 = vandps_avx512vl(auVar84,auVar89);
  uVar64 = vcmpps_avx512vl(auVar92,auVar219,1);
  bVar12 = (bool)((byte)uVar64 & 1);
  auVar93._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._0_4_;
  bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._4_4_;
  bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._8_4_;
  bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar84._12_4_;
  auVar89 = vandps_avx512vl(auVar19,auVar89);
  uVar64 = vcmpps_avx512vl(auVar89,auVar219,1);
  bVar12 = (bool)((byte)uVar64 & 1);
  auVar94._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._0_4_;
  bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._4_4_;
  bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._8_4_;
  bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar19._12_4_;
  auVar92 = vrcp14ps_avx512vl(auVar76);
  auVar220._8_4_ = 0x3f800000;
  auVar220._0_8_ = 0x3f8000003f800000;
  auVar220._12_4_ = 0x3f800000;
  auVar89 = vfnmadd213ps_fma(auVar76,auVar92,auVar220);
  auVar90 = vfmadd132ps_fma(auVar89,auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar93);
  auVar89 = vfnmadd213ps_fma(auVar93,auVar92,auVar220);
  auVar88 = vfmadd132ps_fma(auVar89,auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar94);
  auVar89 = vfnmadd213ps_fma(auVar94,auVar92,auVar220);
  auVar76 = vfmadd132ps_fma(auVar89,auVar92,auVar92);
  auVar186._4_4_ = fVar164;
  auVar186._0_4_ = fVar164;
  auVar186._8_4_ = fVar164;
  auVar186._12_4_ = fVar164;
  auVar89 = vcvtdq2ps_avx(auVar95);
  auVar92 = vcvtdq2ps_avx(auVar226);
  auVar92 = vsubps_avx(auVar92,auVar89);
  auVar95 = vfmadd213ps_fma(auVar92,auVar186,auVar89);
  auVar89 = vcvtdq2ps_avx(auVar96);
  auVar92 = vcvtdq2ps_avx(auVar97);
  auVar92 = vsubps_avx(auVar92,auVar89);
  auVar226 = vfmadd213ps_fma(auVar92,auVar186,auVar89);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar73 * 0x12 + 6);
  auVar89 = vpmovsxwd_avx(auVar19);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar73 * 0x16 + 6);
  auVar92 = vpmovsxwd_avx(auVar85);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar89);
  auVar19 = vfmadd213ps_fma(auVar92,auVar186,auVar89);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar73 * 0x14 + 6);
  auVar89 = vpmovsxwd_avx(auVar81);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar73 * 0x18 + 6);
  auVar92 = vpmovsxwd_avx(auVar82);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar91 = vsubps_avx(auVar92,auVar89);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar73 * 0x1d + 6);
  auVar92 = vpmovsxwd_avx(auVar83);
  auVar91 = vfmadd213ps_fma(auVar91,auVar186,auVar89);
  auVar89 = vcvtdq2ps_avx(auVar92);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar73 * 0x21 + 6);
  auVar92 = vpmovsxwd_avx(auVar84);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar89);
  auVar85 = vfmadd213ps_fma(auVar92,auVar186,auVar89);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar73 * 0x1f + 6);
  auVar89 = vpmovsxwd_avx(auVar86);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar73 * 0x23 + 6);
  auVar92 = vpmovsxwd_avx(auVar87);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,auVar89);
  auVar92 = vfmadd213ps_fma(auVar92,auVar186,auVar89);
  auVar89 = vsubps_avx(auVar95,auVar79);
  auVar187._0_4_ = auVar90._0_4_ * auVar89._0_4_;
  auVar187._4_4_ = auVar90._4_4_ * auVar89._4_4_;
  auVar187._8_4_ = auVar90._8_4_ * auVar89._8_4_;
  auVar187._12_4_ = auVar90._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar226,auVar79);
  auVar165._0_4_ = auVar90._0_4_ * auVar89._0_4_;
  auVar165._4_4_ = auVar90._4_4_ * auVar89._4_4_;
  auVar165._8_4_ = auVar90._8_4_ * auVar89._8_4_;
  auVar165._12_4_ = auVar90._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar19,auVar80);
  auVar205._0_4_ = auVar88._0_4_ * auVar89._0_4_;
  auVar205._4_4_ = auVar88._4_4_ * auVar89._4_4_;
  auVar205._8_4_ = auVar88._8_4_ * auVar89._8_4_;
  auVar205._12_4_ = auVar88._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar91,auVar80);
  auVar79._0_4_ = auVar88._0_4_ * auVar89._0_4_;
  auVar79._4_4_ = auVar88._4_4_ * auVar89._4_4_;
  auVar79._8_4_ = auVar88._8_4_ * auVar89._8_4_;
  auVar79._12_4_ = auVar88._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar85,auVar78);
  auVar80._0_4_ = auVar76._0_4_ * auVar89._0_4_;
  auVar80._4_4_ = auVar76._4_4_ * auVar89._4_4_;
  auVar80._8_4_ = auVar76._8_4_ * auVar89._8_4_;
  auVar80._12_4_ = auVar76._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar92,auVar78);
  auVar97._0_4_ = auVar76._0_4_ * auVar89._0_4_;
  auVar97._4_4_ = auVar76._4_4_ * auVar89._4_4_;
  auVar97._8_4_ = auVar76._8_4_ * auVar89._8_4_;
  auVar97._12_4_ = auVar76._12_4_ * auVar89._12_4_;
  auVar89 = vpminsd_avx(auVar187,auVar165);
  auVar92 = vpminsd_avx(auVar205,auVar79);
  auVar89 = vmaxps_avx(auVar89,auVar92);
  auVar92 = vpminsd_avx(auVar80,auVar97);
  uVar158 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar88._4_4_ = uVar158;
  auVar88._0_4_ = uVar158;
  auVar88._8_4_ = uVar158;
  auVar88._12_4_ = uVar158;
  auVar92 = vmaxps_avx512vl(auVar92,auVar88);
  auVar89 = vmaxps_avx(auVar89,auVar92);
  auVar95._8_4_ = 0x3f7ffffa;
  auVar95._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar95._12_4_ = 0x3f7ffffa;
  local_310 = vmulps_avx512vl(auVar89,auVar95);
  auVar89 = vpmaxsd_avx(auVar187,auVar165);
  auVar92 = vpmaxsd_avx(auVar205,auVar79);
  auVar89 = vminps_avx(auVar89,auVar92);
  auVar92 = vpmaxsd_avx(auVar80,auVar97);
  uVar158 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar226._4_4_ = uVar158;
  auVar226._0_4_ = uVar158;
  auVar226._8_4_ = uVar158;
  auVar226._12_4_ = uVar158;
  auVar92 = vminps_avx512vl(auVar92,auVar226);
  auVar89 = vminps_avx(auVar89,auVar92);
  auVar96._8_4_ = 0x3f800003;
  auVar96._0_8_ = 0x3f8000033f800003;
  auVar96._12_4_ = 0x3f800003;
  auVar89 = vmulps_avx512vl(auVar89,auVar96);
  uVar159 = vcmpps_avx512vl(local_310,auVar89,2);
  uVar22 = vpcmpgtd_avx512vl(auVar77,_DAT_01f4ad30);
  local_5c8 = (ulong)((byte)uVar159 & 0xf & (byte)uVar22);
  local_5d0 = pre->ray_space + k;
  local_618 = (undefined1 (*) [32])&local_140;
  local_300 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar89 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
  auVar228 = ZEXT1664(auVar89);
  local_620 = k;
  local_610 = pre;
  do {
    auVar108 = local_5c0;
    if (local_5c8 == 0) {
      return;
    }
    lVar69 = 0;
    for (uVar64 = local_5c8; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
      lVar69 = lVar69 + 1;
    }
    uVar6 = *(uint *)(prim + 2);
    uVar71 = *(uint *)(prim + lVar69 * 4 + 6);
    local_608 = (ulong)uVar71;
    pGVar68 = (context->scene->geometries).items[uVar6].ptr;
    uVar64 = (ulong)*(uint *)(*(long *)&pGVar68->field_0x58 +
                             local_608 *
                             pGVar68[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    fVar164 = (pGVar68->time_range).lower;
    fVar164 = pGVar68->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar164) / ((pGVar68->time_range).upper - fVar164))
    ;
    auVar89 = vroundss_avx(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),9);
    auVar92 = vaddss_avx512f(ZEXT416((uint)pGVar68->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0)
                            );
    auVar89 = vminss_avx(auVar89,auVar92);
    auVar89 = vmaxss_avx(ZEXT816(0) << 0x20,auVar89);
    fVar164 = fVar164 - auVar89._0_4_;
    fVar20 = 1.0 - fVar164;
    _Var9 = pGVar68[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar66 = (long)(int)auVar89._0_4_ * 0x38;
    lVar70 = *(long *)(_Var9 + 0x10 + lVar66);
    lVar67 = *(long *)(_Var9 + 0x38 + lVar66);
    lVar10 = *(long *)(_Var9 + 0x48 + lVar66);
    auVar77._4_4_ = fVar164;
    auVar77._0_4_ = fVar164;
    auVar77._8_4_ = fVar164;
    auVar77._12_4_ = fVar164;
    pfVar3 = (float *)(lVar67 + lVar10 * uVar64);
    auVar216._0_4_ = fVar164 * *pfVar3;
    auVar216._4_4_ = fVar164 * pfVar3[1];
    auVar216._8_4_ = fVar164 * pfVar3[2];
    auVar216._12_4_ = fVar164 * pfVar3[3];
    lVar69 = uVar64 + 1;
    auVar89 = vmulps_avx512vl(auVar77,*(undefined1 (*) [16])(lVar67 + lVar10 * lVar69));
    p_Var11 = pGVar68[4].occlusionFilterN;
    auVar161._4_4_ = fVar20;
    auVar161._0_4_ = fVar20;
    auVar161._8_4_ = fVar20;
    auVar161._12_4_ = fVar20;
    auVar90 = vfmadd231ps_fma(auVar216,auVar161,
                              *(undefined1 (*) [16])(*(long *)(_Var9 + lVar66) + lVar70 * uVar64));
    auVar86 = vfmadd231ps_avx512vl
                        (auVar89,auVar161,
                         *(undefined1 (*) [16])(*(long *)(_Var9 + lVar66) + lVar70 * lVar69));
    pfVar3 = (float *)(*(long *)(p_Var11 + lVar66 + 0x38) +
                      uVar64 * *(long *)(p_Var11 + lVar66 + 0x48));
    auVar221._0_4_ = fVar164 * *pfVar3;
    auVar221._4_4_ = fVar164 * pfVar3[1];
    auVar221._8_4_ = fVar164 * pfVar3[2];
    auVar221._12_4_ = fVar164 * pfVar3[3];
    pfVar3 = (float *)(*(long *)(p_Var11 + lVar66 + 0x38) +
                      *(long *)(p_Var11 + lVar66 + 0x48) * lVar69);
    auVar222._0_4_ = fVar164 * *pfVar3;
    auVar222._4_4_ = fVar164 * pfVar3[1];
    auVar222._8_4_ = fVar164 * pfVar3[2];
    auVar222._12_4_ = fVar164 * pfVar3[3];
    auVar92 = vfmadd231ps_fma(auVar221,auVar161,
                              *(undefined1 (*) [16])
                               (*(long *)(p_Var11 + lVar66) +
                               *(long *)(p_Var11 + lVar66 + 0x10) * uVar64));
    auVar91 = vfmadd231ps_fma(auVar222,auVar161,
                              *(undefined1 (*) [16])
                               (*(long *)(p_Var11 + lVar66) +
                               *(long *)(p_Var11 + lVar66 + 0x10) * lVar69));
    auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    iVar7 = (int)pGVar68[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar96 = auVar228._0_16_;
    auVar87 = vfnmadd213ps_avx512vl(auVar92,auVar96,auVar90);
    auVar88 = vfmadd213ps_avx512vl(auVar91,auVar96,auVar86);
    auVar91 = vsubps_avx(auVar90,auVar89);
    uVar158 = auVar91._0_4_;
    auVar174._4_4_ = uVar158;
    auVar174._0_4_ = uVar158;
    auVar174._8_4_ = uVar158;
    auVar174._12_4_ = uVar158;
    auVar92 = vshufps_avx(auVar91,auVar91,0x55);
    aVar4 = (local_5d0->vx).field_0;
    aVar5 = (local_5d0->vy).field_0;
    auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
    fVar164 = (local_5d0->vz).field_0.m128[0];
    fVar20 = *(float *)((long)&(local_5d0->vz).field_0 + 4);
    fVar54 = *(float *)((long)&(local_5d0->vz).field_0 + 8);
    fVar55 = *(float *)((long)&(local_5d0->vz).field_0 + 0xc);
    auVar209._0_4_ = fVar164 * auVar91._0_4_;
    auVar209._4_4_ = fVar20 * auVar91._4_4_;
    auVar209._8_4_ = fVar54 * auVar91._8_4_;
    auVar209._12_4_ = fVar55 * auVar91._12_4_;
    auVar92 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar5,auVar92);
    auVar19 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar4,auVar174);
    auVar91 = vsubps_avx(auVar87,auVar89);
    uVar158 = auVar91._0_4_;
    auVar175._4_4_ = uVar158;
    auVar175._0_4_ = uVar158;
    auVar175._8_4_ = uVar158;
    auVar175._12_4_ = uVar158;
    auVar92 = vshufps_avx(auVar91,auVar91,0x55);
    auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
    auVar212._0_4_ = fVar164 * auVar91._0_4_;
    auVar212._4_4_ = fVar20 * auVar91._4_4_;
    auVar212._8_4_ = fVar54 * auVar91._8_4_;
    auVar212._12_4_ = fVar55 * auVar91._12_4_;
    auVar92 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar5,auVar92);
    auVar85 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar4,auVar175);
    auVar91 = vsubps_avx(auVar88,auVar89);
    uVar158 = auVar91._0_4_;
    auVar176._4_4_ = uVar158;
    auVar176._0_4_ = uVar158;
    auVar176._8_4_ = uVar158;
    auVar176._12_4_ = uVar158;
    auVar92 = vshufps_avx(auVar91,auVar91,0x55);
    auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
    auVar215._0_4_ = fVar164 * auVar91._0_4_;
    auVar215._4_4_ = fVar20 * auVar91._4_4_;
    auVar215._8_4_ = fVar54 * auVar91._8_4_;
    auVar215._12_4_ = fVar55 * auVar91._12_4_;
    auVar92 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar5,auVar92);
    auVar91 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar4,auVar176);
    auVar92 = vsubps_avx512vl(auVar86,auVar89);
    uVar158 = auVar92._0_4_;
    auVar177._4_4_ = uVar158;
    auVar177._0_4_ = uVar158;
    auVar177._8_4_ = uVar158;
    auVar177._12_4_ = uVar158;
    auVar89 = vshufps_avx(auVar92,auVar92,0x55);
    auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
    auVar218._0_4_ = fVar164 * auVar92._0_4_;
    auVar218._4_4_ = fVar20 * auVar92._4_4_;
    auVar218._8_4_ = fVar54 * auVar92._8_4_;
    auVar218._12_4_ = fVar55 * auVar92._12_4_;
    auVar89 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar5,auVar89);
    lVar69 = (long)iVar7;
    lVar70 = lVar69 * 0x44;
    auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar70);
    auVar81 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar177);
    uVar158 = auVar19._0_4_;
    local_460._4_4_ = uVar158;
    local_460._0_4_ = uVar158;
    local_460._8_4_ = uVar158;
    local_460._12_4_ = uVar158;
    local_460._16_4_ = uVar158;
    local_460._20_4_ = uVar158;
    local_460._24_4_ = uVar158;
    local_460._28_4_ = uVar158;
    auVar98._8_4_ = 1;
    auVar98._0_8_ = 0x100000001;
    auVar98._12_4_ = 1;
    auVar98._16_4_ = 1;
    auVar98._20_4_ = 1;
    auVar98._24_4_ = 1;
    auVar98._28_4_ = 1;
    local_480 = vpermps_avx2(auVar98,ZEXT1632(auVar19));
    auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x484);
    uVar158 = auVar85._0_4_;
    auVar178._4_4_ = uVar158;
    auVar178._0_4_ = uVar158;
    auVar178._8_4_ = uVar158;
    auVar178._12_4_ = uVar158;
    local_4a0._16_4_ = uVar158;
    local_4a0._0_16_ = auVar178;
    local_4a0._20_4_ = uVar158;
    local_4a0._24_4_ = uVar158;
    local_4a0._28_4_ = uVar158;
    local_4c0 = vpermps_avx512vl(auVar98,ZEXT1632(auVar85));
    auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x908);
    local_4e0 = vbroadcastss_avx512vl(auVar91);
    auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0xd8c);
    local_500 = vpermps_avx512vl(auVar98,ZEXT1632(auVar91));
    uVar158 = auVar81._0_4_;
    local_520._4_4_ = uVar158;
    local_520._0_4_ = uVar158;
    fStack_518 = (float)uVar158;
    fStack_514 = (float)uVar158;
    fStack_510 = (float)uVar158;
    fStack_50c = (float)uVar158;
    fStack_508 = (float)uVar158;
    register0x0000139c = uVar158;
    _local_540 = vpermps_avx512vl(auVar98,ZEXT1632(auVar81));
    auVar98 = vmulps_avx512vl(_local_520,auVar111);
    auVar99 = vmulps_avx512vl(_local_540,auVar111);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar112,local_4e0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar112,local_500);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar114,local_4a0);
    auVar100 = vfmadd231ps_avx512vl(auVar99,auVar114,local_4c0);
    auVar101 = vfmadd231ps_avx512vl(auVar98,auVar110,local_460);
    auVar203 = ZEXT3264(auVar101);
    auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar70);
    auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x484);
    auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x908);
    auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0xd8c);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar110,local_480);
    auVar194 = ZEXT3264(auVar100);
    auVar102 = vmulps_avx512vl(_local_520,auVar109);
    auVar103 = vmulps_avx512vl(_local_540,auVar109);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar113,local_4e0);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar113,local_500);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar99,local_4a0);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar99,local_4c0);
    auVar82 = vfmadd231ps_fma(auVar102,auVar98,local_460);
    auVar206 = ZEXT1664(auVar82);
    auVar83 = vfmadd231ps_fma(auVar103,auVar98,local_480);
    auVar102 = vsubps_avx512vl(ZEXT1632(auVar82),auVar101);
    auVar103 = vsubps_avx512vl(ZEXT1632(auVar83),auVar100);
    auVar104 = vmulps_avx512vl(auVar100,auVar102);
    auVar105 = vmulps_avx512vl(auVar101,auVar103);
    auVar104 = vsubps_avx512vl(auVar104,auVar105);
    auVar89 = vshufps_avx(auVar90,auVar90,0xff);
    uVar159 = auVar89._0_8_;
    local_80._8_8_ = uVar159;
    local_80._0_8_ = uVar159;
    local_80._16_8_ = uVar159;
    local_80._24_8_ = uVar159;
    auVar89 = vshufps_avx(auVar87,auVar87,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar89);
    auVar89 = vshufps_avx(auVar88,auVar88,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar89);
    auVar89 = vshufps_avx512vl(auVar86,auVar86,0xff);
    uVar159 = auVar89._0_8_;
    local_e0._8_8_ = uVar159;
    local_e0._0_8_ = uVar159;
    local_e0._16_8_ = uVar159;
    local_e0._24_8_ = uVar159;
    auVar105 = vmulps_avx512vl(local_e0,auVar111);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar112,local_c0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar114,local_a0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar110,local_80);
    auVar106 = vmulps_avx512vl(local_e0,auVar109);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar113,local_c0);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar99,local_a0);
    auVar84 = vfmadd231ps_fma(auVar106,auVar98,local_80);
    auVar106 = vmulps_avx512vl(auVar103,auVar103);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,auVar102);
    auVar107 = vmaxps_avx512vl(auVar105,ZEXT1632(auVar84));
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vmulps_avx512vl(auVar107,auVar106);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    uVar159 = vcmpps_avx512vl(auVar104,auVar106,2);
    auVar89 = vblendps_avx(auVar19,auVar90,8);
    auVar226 = auVar227._0_16_;
    auVar92 = vandps_avx512vl(auVar89,auVar226);
    auVar89 = vblendps_avx(auVar85,auVar87,8);
    auVar89 = vandps_avx512vl(auVar89,auVar226);
    auVar92 = vmaxps_avx(auVar92,auVar89);
    auVar89 = vblendps_avx(auVar91,auVar88,8);
    auVar95 = vandps_avx512vl(auVar89,auVar226);
    auVar89 = vblendps_avx(auVar81,auVar86,8);
    auVar89 = vandps_avx512vl(auVar89,auVar226);
    auVar89 = vmaxps_avx(auVar95,auVar89);
    auVar89 = vmaxps_avx(auVar92,auVar89);
    auVar92 = vmovshdup_avx(auVar89);
    auVar92 = vmaxss_avx(auVar92,auVar89);
    auVar89 = vshufpd_avx(auVar89,auVar89,1);
    auVar89 = vmaxss_avx(auVar89,auVar92);
    auVar104._0_4_ = (float)iVar7;
    local_5c0._4_12_ = auVar88._4_12_;
    local_5c0._0_4_ = auVar104._0_4_;
    local_5c0._16_16_ = auVar108._16_16_;
    auVar104._4_4_ = auVar104._0_4_;
    auVar104._8_4_ = auVar104._0_4_;
    auVar104._12_4_ = auVar104._0_4_;
    auVar104._16_4_ = auVar104._0_4_;
    auVar104._20_4_ = auVar104._0_4_;
    auVar104._24_4_ = auVar104._0_4_;
    auVar104._28_4_ = auVar104._0_4_;
    uVar22 = vcmpps_avx512vl(auVar104,_DAT_01f7b060,0xe);
    bVar72 = (byte)uVar159 & (byte)uVar22;
    fVar164 = auVar89._0_4_ * 4.7683716e-07;
    local_640 = ZEXT416((uint)fVar164);
    auVar108._8_4_ = 2;
    auVar108._0_8_ = 0x200000002;
    auVar108._12_4_ = 2;
    auVar108._16_4_ = 2;
    auVar108._20_4_ = 2;
    auVar108._24_4_ = 2;
    auVar108._28_4_ = 2;
    local_240 = vpermps_avx2(auVar108,ZEXT1632(auVar19));
    local_260 = vpermps_avx2(auVar108,ZEXT1632(auVar85));
    local_280 = vpermps_avx2(auVar108,ZEXT1632(auVar91));
    local_2a0 = vpermps_avx2(auVar108,ZEXT1632(auVar81));
    local_560 = *(undefined4 *)(ray + k * 4 + 0x60);
    uStack_55c = 0;
    uStack_558 = 0;
    uStack_554 = 0;
    local_2c0 = vpbroadcastd_avx512vl();
    local_2e0 = vpbroadcastd_avx512vl();
    local_680 = auVar90._0_8_;
    uStack_678 = auVar90._8_8_;
    local_6a0 = auVar87._0_8_;
    uStack_698 = auVar87._8_8_;
    local_6b0 = auVar88._0_8_;
    uStack_6a8 = auVar88._8_8_;
    local_690._0_4_ = auVar86._0_4_;
    fVar20 = (float)local_690;
    local_690._4_4_ = auVar86._4_4_;
    fVar54 = local_690._4_4_;
    uStack_688._0_4_ = auVar86._8_4_;
    fVar55 = (float)uStack_688;
    uStack_688._4_4_ = auVar86._12_4_;
    fVar62 = uStack_688._4_4_;
    local_690 = auVar86._0_8_;
    uStack_688 = auVar86._8_8_;
    if (bVar72 != 0) {
      auVar108 = vmulps_avx512vl(local_2a0,auVar109);
      auVar108 = vfmadd213ps_avx512vl(auVar113,local_280,auVar108);
      auVar108 = vfmadd213ps_avx512vl(auVar99,local_260,auVar108);
      auVar98 = vfmadd213ps_avx512vl(auVar98,local_240,auVar108);
      auVar108 = vmulps_avx512vl(local_2a0,auVar111);
      auVar108 = vfmadd213ps_avx512vl(auVar112,local_280,auVar108);
      auVar99 = vfmadd213ps_avx512vl(auVar114,local_260,auVar108);
      auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1210);
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1694);
      auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1b18);
      auVar111 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1f9c);
      auVar109 = vfmadd213ps_avx512vl(auVar110,local_240,auVar99);
      auVar110 = vmulps_avx512vl(_local_520,auVar111);
      auVar99 = vmulps_avx512vl(_local_540,auVar111);
      auVar111 = vmulps_avx512vl(local_2a0,auVar111);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar112,local_4e0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar112,local_500);
      auVar112 = vfmadd231ps_avx512vl(auVar111,local_280,auVar112);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar114,local_4a0);
      auVar111 = vfmadd231ps_avx512vl(auVar99,auVar114,local_4c0);
      auVar99 = vfmadd231ps_avx512vl(auVar112,local_260,auVar114);
      auVar89 = vfmadd231ps_fma(auVar110,auVar108,local_460);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,local_480);
      auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1210);
      auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1b18);
      auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1f9c);
      auVar99 = vfmadd231ps_avx512vl(auVar99,local_240,auVar108);
      auVar108 = vmulps_avx512vl(_local_520,auVar112);
      auVar113 = vmulps_avx512vl(_local_540,auVar112);
      auVar112 = vmulps_avx512vl(local_2a0,auVar112);
      auVar106 = vfmadd231ps_avx512vl(auVar108,auVar114,local_4e0);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar114,local_500);
      auVar114 = vfmadd231ps_avx512vl(auVar112,local_280,auVar114);
      auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1694);
      auVar112 = vfmadd231ps_avx512vl(auVar106,auVar108,local_4a0);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar108,local_4c0);
      auVar108 = vfmadd231ps_avx512vl(auVar114,local_260,auVar108);
      auVar228 = ZEXT1664(auVar96);
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar227 = ZEXT1664(auVar92);
      auVar92 = vfmadd231ps_fma(auVar112,auVar110,local_460);
      auVar114 = vfmadd231ps_avx512vl(auVar113,auVar110,local_480);
      auVar112 = vfmadd231ps_avx512vl(auVar108,local_240,auVar110);
      auVar224._8_4_ = 0x7fffffff;
      auVar224._0_8_ = 0x7fffffff7fffffff;
      auVar224._12_4_ = 0x7fffffff;
      auVar224._16_4_ = 0x7fffffff;
      auVar224._20_4_ = 0x7fffffff;
      auVar224._24_4_ = 0x7fffffff;
      auVar224._28_4_ = 0x7fffffff;
      auVar108 = vandps_avx(ZEXT1632(auVar89),auVar224);
      auVar110 = vandps_avx(auVar111,auVar224);
      auVar110 = vmaxps_avx(auVar108,auVar110);
      auVar108 = vandps_avx(auVar99,auVar224);
      auVar108 = vmaxps_avx(auVar110,auVar108);
      auVar217._4_4_ = fVar164;
      auVar217._0_4_ = fVar164;
      auVar217._8_4_ = fVar164;
      auVar217._12_4_ = fVar164;
      auVar217._16_4_ = fVar164;
      auVar217._20_4_ = fVar164;
      auVar217._24_4_ = fVar164;
      auVar217._28_4_ = fVar164;
      uVar64 = vcmpps_avx512vl(auVar108,auVar217,1);
      bVar12 = (bool)((byte)uVar64 & 1);
      auVar106._0_4_ = (float)((uint)bVar12 * auVar102._0_4_ | (uint)!bVar12 * auVar89._0_4_);
      bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar89._4_4_);
      bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar89._8_4_);
      bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar89._12_4_);
      fVar211 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar102._16_4_);
      auVar106._16_4_ = fVar211;
      fVar210 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar102._20_4_);
      auVar106._20_4_ = fVar210;
      fVar208 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar102._24_4_);
      auVar106._24_4_ = fVar208;
      uVar65 = (uint)(byte)(uVar64 >> 7) * auVar102._28_4_;
      auVar106._28_4_ = uVar65;
      bVar12 = (bool)((byte)uVar64 & 1);
      auVar107._0_4_ = (float)((uint)bVar12 * auVar103._0_4_ | (uint)!bVar12 * auVar111._0_4_);
      bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar111._4_4_);
      bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar111._8_4_);
      bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar111._12_4_);
      bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar107._16_4_ = (float)((uint)bVar12 * auVar103._16_4_ | (uint)!bVar12 * auVar111._16_4_);
      bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar107._20_4_ = (float)((uint)bVar12 * auVar103._20_4_ | (uint)!bVar12 * auVar111._20_4_);
      bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar107._24_4_ = (float)((uint)bVar12 * auVar103._24_4_ | (uint)!bVar12 * auVar111._24_4_);
      bVar12 = SUB81(uVar64 >> 7,0);
      auVar107._28_4_ = (uint)bVar12 * auVar103._28_4_ | (uint)!bVar12 * auVar111._28_4_;
      auVar108 = vandps_avx(auVar224,ZEXT1632(auVar92));
      auVar110 = vandps_avx(auVar114,auVar224);
      auVar110 = vmaxps_avx(auVar108,auVar110);
      auVar108 = vandps_avx(auVar112,auVar224);
      auVar108 = vmaxps_avx(auVar110,auVar108);
      uVar64 = vcmpps_avx512vl(auVar108,auVar217,1);
      bVar12 = (bool)((byte)uVar64 & 1);
      auVar115._0_4_ = (float)((uint)bVar12 * auVar102._0_4_ | (uint)!bVar12 * auVar92._0_4_);
      bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar115._4_4_ = (float)((uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar92._4_4_);
      bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar115._8_4_ = (float)((uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar92._8_4_);
      bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar115._12_4_ = (float)((uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar92._12_4_);
      fVar172 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar102._16_4_);
      auVar115._16_4_ = fVar172;
      fVar163 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar102._20_4_);
      auVar115._20_4_ = fVar163;
      fVar173 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar102._24_4_);
      auVar115._24_4_ = fVar173;
      auVar115._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar102._28_4_;
      bVar12 = (bool)((byte)uVar64 & 1);
      auVar116._0_4_ = (float)((uint)bVar12 * auVar103._0_4_ | (uint)!bVar12 * auVar114._0_4_);
      bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar114._4_4_);
      bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar114._8_4_);
      bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar114._12_4_);
      bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar116._16_4_ = (float)((uint)bVar12 * auVar103._16_4_ | (uint)!bVar12 * auVar114._16_4_);
      bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar116._20_4_ = (float)((uint)bVar12 * auVar103._20_4_ | (uint)!bVar12 * auVar114._20_4_);
      bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar116._24_4_ = (float)((uint)bVar12 * auVar103._24_4_ | (uint)!bVar12 * auVar114._24_4_);
      bVar12 = SUB81(uVar64 >> 7,0);
      auVar116._28_4_ = (uint)bVar12 * auVar103._28_4_ | (uint)!bVar12 * auVar114._28_4_;
      auVar96 = vxorps_avx512vl(auVar178,auVar178);
      auVar108 = vfmadd213ps_avx512vl(auVar106,auVar106,ZEXT1632(auVar96));
      auVar89 = vfmadd231ps_fma(auVar108,auVar107,auVar107);
      auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
      fVar74 = auVar108._0_4_;
      fVar75 = auVar108._4_4_;
      fVar138 = auVar108._8_4_;
      fVar139 = auVar108._12_4_;
      fVar140 = auVar108._16_4_;
      fVar141 = auVar108._20_4_;
      fVar142 = auVar108._24_4_;
      auVar110._4_4_ = fVar75 * fVar75 * fVar75 * auVar89._4_4_ * -0.5;
      auVar110._0_4_ = fVar74 * fVar74 * fVar74 * auVar89._0_4_ * -0.5;
      auVar110._8_4_ = fVar138 * fVar138 * fVar138 * auVar89._8_4_ * -0.5;
      auVar110._12_4_ = fVar139 * fVar139 * fVar139 * auVar89._12_4_ * -0.5;
      auVar110._16_4_ = fVar140 * fVar140 * fVar140 * -0.0;
      auVar110._20_4_ = fVar141 * fVar141 * fVar141 * -0.0;
      auVar110._24_4_ = fVar142 * fVar142 * fVar142 * -0.0;
      auVar110._28_4_ = 0;
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar99,auVar108);
      auVar114._4_4_ = auVar107._4_4_ * auVar110._4_4_;
      auVar114._0_4_ = auVar107._0_4_ * auVar110._0_4_;
      auVar114._8_4_ = auVar107._8_4_ * auVar110._8_4_;
      auVar114._12_4_ = auVar107._12_4_ * auVar110._12_4_;
      auVar114._16_4_ = auVar107._16_4_ * auVar110._16_4_;
      auVar114._20_4_ = auVar107._20_4_ * auVar110._20_4_;
      auVar114._24_4_ = auVar107._24_4_ * auVar110._24_4_;
      auVar114._28_4_ = auVar108._28_4_;
      auVar112._4_4_ = auVar110._4_4_ * -auVar106._4_4_;
      auVar112._0_4_ = auVar110._0_4_ * -auVar106._0_4_;
      auVar112._8_4_ = auVar110._8_4_ * -auVar106._8_4_;
      auVar112._12_4_ = auVar110._12_4_ * -auVar106._12_4_;
      auVar112._16_4_ = auVar110._16_4_ * -fVar211;
      auVar112._20_4_ = auVar110._20_4_ * -fVar210;
      auVar112._24_4_ = auVar110._24_4_ * -fVar208;
      auVar112._28_4_ = uVar65 ^ 0x80000000;
      auVar108 = vmulps_avx512vl(auVar110,ZEXT1632(auVar96));
      auVar103 = ZEXT1632(auVar96);
      auVar111 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar103);
      auVar89 = vfmadd231ps_fma(auVar111,auVar116,auVar116);
      auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
      fVar208 = auVar113._0_4_;
      fVar210 = auVar113._4_4_;
      fVar211 = auVar113._8_4_;
      fVar74 = auVar113._12_4_;
      fVar75 = auVar113._16_4_;
      fVar138 = auVar113._20_4_;
      fVar139 = auVar113._24_4_;
      auVar111._4_4_ = fVar210 * fVar210 * fVar210 * auVar89._4_4_ * -0.5;
      auVar111._0_4_ = fVar208 * fVar208 * fVar208 * auVar89._0_4_ * -0.5;
      auVar111._8_4_ = fVar211 * fVar211 * fVar211 * auVar89._8_4_ * -0.5;
      auVar111._12_4_ = fVar74 * fVar74 * fVar74 * auVar89._12_4_ * -0.5;
      auVar111._16_4_ = fVar75 * fVar75 * fVar75 * -0.0;
      auVar111._20_4_ = fVar138 * fVar138 * fVar138 * -0.0;
      auVar111._24_4_ = fVar139 * fVar139 * fVar139 * -0.0;
      auVar111._28_4_ = 0;
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar99,auVar113);
      auVar99._4_4_ = auVar116._4_4_ * auVar111._4_4_;
      auVar99._0_4_ = auVar116._0_4_ * auVar111._0_4_;
      auVar99._8_4_ = auVar116._8_4_ * auVar111._8_4_;
      auVar99._12_4_ = auVar116._12_4_ * auVar111._12_4_;
      auVar99._16_4_ = auVar116._16_4_ * auVar111._16_4_;
      auVar99._20_4_ = auVar116._20_4_ * auVar111._20_4_;
      auVar99._24_4_ = auVar116._24_4_ * auVar111._24_4_;
      auVar99._28_4_ = auVar113._28_4_;
      auVar113._4_4_ = -auVar115._4_4_ * auVar111._4_4_;
      auVar113._0_4_ = -auVar115._0_4_ * auVar111._0_4_;
      auVar113._8_4_ = -auVar115._8_4_ * auVar111._8_4_;
      auVar113._12_4_ = -auVar115._12_4_ * auVar111._12_4_;
      auVar113._16_4_ = -fVar172 * auVar111._16_4_;
      auVar113._20_4_ = -fVar163 * auVar111._20_4_;
      auVar113._24_4_ = -fVar173 * auVar111._24_4_;
      auVar113._28_4_ = auVar110._28_4_;
      auVar110 = vmulps_avx512vl(auVar111,auVar103);
      auVar89 = vfmadd213ps_fma(auVar114,auVar105,auVar101);
      auVar92 = vfmadd213ps_fma(auVar112,auVar105,auVar100);
      auVar111 = vfmadd213ps_avx512vl(auVar108,auVar105,auVar109);
      auVar102 = vfmadd213ps_avx512vl(auVar99,ZEXT1632(auVar84),ZEXT1632(auVar82));
      auVar86 = vfnmadd213ps_fma(auVar114,auVar105,auVar101);
      auVar101 = ZEXT1632(auVar84);
      auVar91 = vfmadd213ps_fma(auVar113,auVar101,ZEXT1632(auVar83));
      auVar95 = vfnmadd213ps_fma(auVar112,auVar105,auVar100);
      auVar19 = vfmadd213ps_fma(auVar110,auVar101,auVar98);
      auVar114 = vfnmadd231ps_avx512vl(auVar109,auVar105,auVar108);
      auVar82 = vfnmadd213ps_fma(auVar99,auVar101,ZEXT1632(auVar82));
      auVar83 = vfnmadd213ps_fma(auVar113,auVar101,ZEXT1632(auVar83));
      auVar226 = vfnmadd231ps_fma(auVar98,ZEXT1632(auVar84),auVar110);
      auVar110 = vsubps_avx512vl(auVar102,ZEXT1632(auVar86));
      auVar108 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar95));
      auVar112 = vsubps_avx512vl(ZEXT1632(auVar19),auVar114);
      auVar98 = vmulps_avx512vl(auVar108,auVar114);
      auVar85 = vfmsub231ps_fma(auVar98,ZEXT1632(auVar95),auVar112);
      auVar109._4_4_ = auVar86._4_4_ * auVar112._4_4_;
      auVar109._0_4_ = auVar86._0_4_ * auVar112._0_4_;
      auVar109._8_4_ = auVar86._8_4_ * auVar112._8_4_;
      auVar109._12_4_ = auVar86._12_4_ * auVar112._12_4_;
      auVar109._16_4_ = auVar112._16_4_ * 0.0;
      auVar109._20_4_ = auVar112._20_4_ * 0.0;
      auVar109._24_4_ = auVar112._24_4_ * 0.0;
      auVar109._28_4_ = auVar112._28_4_;
      auVar112 = vfmsub231ps_avx512vl(auVar109,auVar114,auVar110);
      auVar100._4_4_ = auVar95._4_4_ * auVar110._4_4_;
      auVar100._0_4_ = auVar95._0_4_ * auVar110._0_4_;
      auVar100._8_4_ = auVar95._8_4_ * auVar110._8_4_;
      auVar100._12_4_ = auVar95._12_4_ * auVar110._12_4_;
      auVar100._16_4_ = auVar110._16_4_ * 0.0;
      auVar100._20_4_ = auVar110._20_4_ * 0.0;
      auVar100._24_4_ = auVar110._24_4_ * 0.0;
      auVar100._28_4_ = auVar110._28_4_;
      auVar81 = vfmsub231ps_fma(auVar100,ZEXT1632(auVar86),auVar108);
      auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar103,auVar112);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar103,ZEXT1632(auVar85));
      auVar106 = ZEXT1632(auVar96);
      uVar64 = vcmpps_avx512vl(auVar108,auVar106,2);
      bVar63 = (byte)uVar64;
      fVar74 = (float)((uint)(bVar63 & 1) * auVar89._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar82._0_4_);
      bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
      fVar138 = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar82._4_4_);
      bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
      fVar140 = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar82._8_4_);
      bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
      fVar142 = (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar82._12_4_);
      auVar99 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar140,CONCAT44(fVar138,fVar74))));
      fVar75 = (float)((uint)(bVar63 & 1) * auVar92._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar83._0_4_);
      bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
      fVar139 = (float)((uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar83._4_4_);
      bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
      fVar141 = (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar83._8_4_);
      bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
      fVar143 = (float)((uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar83._12_4_);
      auVar113 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar75))));
      auVar117._0_4_ =
           (float)((uint)(bVar63 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar226._0_4_)
      ;
      bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar117._4_4_ = (float)((uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * auVar226._4_4_);
      bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar117._8_4_ = (float)((uint)bVar12 * auVar111._8_4_ | (uint)!bVar12 * auVar226._8_4_);
      bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar117._12_4_ = (float)((uint)bVar12 * auVar111._12_4_ | (uint)!bVar12 * auVar226._12_4_);
      fVar211 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar111._16_4_);
      auVar117._16_4_ = fVar211;
      fVar208 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar111._20_4_);
      auVar117._20_4_ = fVar208;
      fVar210 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar111._24_4_);
      auVar117._24_4_ = fVar210;
      iVar1 = (uint)(byte)(uVar64 >> 7) * auVar111._28_4_;
      auVar117._28_4_ = iVar1;
      auVar110 = vblendmps_avx512vl(ZEXT1632(auVar86),auVar102);
      auVar118._0_4_ =
           (uint)(bVar63 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar92._0_4_;
      bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * auVar92._4_4_;
      bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * auVar92._8_4_;
      bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * auVar92._12_4_;
      auVar118._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar110._16_4_;
      auVar118._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar110._20_4_;
      auVar118._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar110._24_4_;
      auVar118._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar110._28_4_;
      auVar110 = vblendmps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar91));
      auVar119._0_4_ =
           (float)((uint)(bVar63 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar85._0_4_);
      bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar119._4_4_ = (float)((uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * auVar85._4_4_);
      bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar119._8_4_ = (float)((uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * auVar85._8_4_);
      bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar119._12_4_ = (float)((uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * auVar85._12_4_);
      fVar163 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar110._16_4_);
      auVar119._16_4_ = fVar163;
      fVar173 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar110._20_4_);
      auVar119._20_4_ = fVar173;
      fVar172 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar110._24_4_);
      auVar119._24_4_ = fVar172;
      auVar119._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar110._28_4_;
      auVar110 = vblendmps_avx512vl(auVar114,ZEXT1632(auVar19));
      auVar120._0_4_ =
           (float)((uint)(bVar63 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar111._0_4_)
      ;
      bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar120._4_4_ = (float)((uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * auVar111._4_4_);
      bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar120._8_4_ = (float)((uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * auVar111._8_4_);
      bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar120._12_4_ = (float)((uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * auVar111._12_4_);
      bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar120._16_4_ = (float)((uint)bVar12 * auVar110._16_4_ | (uint)!bVar12 * auVar111._16_4_);
      bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar120._20_4_ = (float)((uint)bVar12 * auVar110._20_4_ | (uint)!bVar12 * auVar111._20_4_);
      bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar120._24_4_ = (float)((uint)bVar12 * auVar110._24_4_ | (uint)!bVar12 * auVar111._24_4_);
      bVar12 = SUB81(uVar64 >> 7,0);
      auVar120._28_4_ = (uint)bVar12 * auVar110._28_4_ | (uint)!bVar12 * auVar111._28_4_;
      auVar121._0_4_ =
           (uint)(bVar63 & 1) * (int)auVar86._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar102._0_4_;
      bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar12 * (int)auVar86._4_4_ | (uint)!bVar12 * auVar102._4_4_;
      bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar12 * (int)auVar86._8_4_ | (uint)!bVar12 * auVar102._8_4_;
      bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar12 * (int)auVar86._12_4_ | (uint)!bVar12 * auVar102._12_4_;
      auVar121._16_4_ = (uint)!(bool)((byte)(uVar64 >> 4) & 1) * auVar102._16_4_;
      auVar121._20_4_ = (uint)!(bool)((byte)(uVar64 >> 5) & 1) * auVar102._20_4_;
      auVar121._24_4_ = (uint)!(bool)((byte)(uVar64 >> 6) & 1) * auVar102._24_4_;
      auVar121._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar102._28_4_;
      bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar122._0_4_ =
           (uint)(bVar63 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar19._0_4_;
      bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar19._4_4_;
      bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar19._8_4_;
      bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar19._12_4_;
      auVar122._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar114._16_4_;
      auVar122._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar114._20_4_;
      auVar122._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar114._24_4_;
      iVar2 = (uint)(byte)(uVar64 >> 7) * auVar114._28_4_;
      auVar122._28_4_ = iVar2;
      auVar109 = vsubps_avx512vl(auVar121,auVar99);
      auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar95._12_4_ |
                                               (uint)!bVar15 * auVar91._12_4_,
                                               CONCAT48((uint)bVar14 * (int)auVar95._8_4_ |
                                                        (uint)!bVar14 * auVar91._8_4_,
                                                        CONCAT44((uint)bVar12 * (int)auVar95._4_4_ |
                                                                 (uint)!bVar12 * auVar91._4_4_,
                                                                 (uint)(bVar63 & 1) *
                                                                 (int)auVar95._0_4_ |
                                                                 (uint)!(bool)(bVar63 & 1) *
                                                                 auVar91._0_4_)))),auVar113);
      auVar203 = ZEXT3264(auVar110);
      auVar114 = vsubps_avx(auVar122,auVar117);
      auVar112 = vsubps_avx(auVar99,auVar118);
      auVar206 = ZEXT3264(auVar112);
      auVar111 = vsubps_avx(auVar113,auVar119);
      auVar98 = vsubps_avx(auVar117,auVar120);
      auVar101._4_4_ = auVar114._4_4_ * fVar138;
      auVar101._0_4_ = auVar114._0_4_ * fVar74;
      auVar101._8_4_ = auVar114._8_4_ * fVar140;
      auVar101._12_4_ = auVar114._12_4_ * fVar142;
      auVar101._16_4_ = auVar114._16_4_ * 0.0;
      auVar101._20_4_ = auVar114._20_4_ * 0.0;
      auVar101._24_4_ = auVar114._24_4_ * 0.0;
      auVar101._28_4_ = iVar2;
      auVar89 = vfmsub231ps_fma(auVar101,auVar117,auVar109);
      auVar102._4_4_ = fVar139 * auVar109._4_4_;
      auVar102._0_4_ = fVar75 * auVar109._0_4_;
      auVar102._8_4_ = fVar141 * auVar109._8_4_;
      auVar102._12_4_ = fVar143 * auVar109._12_4_;
      auVar102._16_4_ = auVar109._16_4_ * 0.0;
      auVar102._20_4_ = auVar109._20_4_ * 0.0;
      auVar102._24_4_ = auVar109._24_4_ * 0.0;
      auVar102._28_4_ = auVar108._28_4_;
      auVar92 = vfmsub231ps_fma(auVar102,auVar99,auVar110);
      auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar106,ZEXT1632(auVar89));
      auVar188._0_4_ = auVar110._0_4_ * auVar117._0_4_;
      auVar188._4_4_ = auVar110._4_4_ * auVar117._4_4_;
      auVar188._8_4_ = auVar110._8_4_ * auVar117._8_4_;
      auVar188._12_4_ = auVar110._12_4_ * auVar117._12_4_;
      auVar188._16_4_ = auVar110._16_4_ * fVar211;
      auVar188._20_4_ = auVar110._20_4_ * fVar208;
      auVar188._24_4_ = auVar110._24_4_ * fVar210;
      auVar188._28_4_ = 0;
      auVar89 = vfmsub231ps_fma(auVar188,auVar113,auVar114);
      auVar100 = vfmadd231ps_avx512vl(auVar108,auVar106,ZEXT1632(auVar89));
      auVar108 = vmulps_avx512vl(auVar98,auVar118);
      auVar108 = vfmsub231ps_avx512vl(auVar108,auVar112,auVar120);
      auVar103._4_4_ = auVar111._4_4_ * auVar120._4_4_;
      auVar103._0_4_ = auVar111._0_4_ * auVar120._0_4_;
      auVar103._8_4_ = auVar111._8_4_ * auVar120._8_4_;
      auVar103._12_4_ = auVar111._12_4_ * auVar120._12_4_;
      auVar103._16_4_ = auVar111._16_4_ * auVar120._16_4_;
      auVar103._20_4_ = auVar111._20_4_ * auVar120._20_4_;
      auVar103._24_4_ = auVar111._24_4_ * auVar120._24_4_;
      auVar103._28_4_ = auVar120._28_4_;
      auVar89 = vfmsub231ps_fma(auVar103,auVar119,auVar98);
      auVar189._0_4_ = auVar119._0_4_ * auVar112._0_4_;
      auVar189._4_4_ = auVar119._4_4_ * auVar112._4_4_;
      auVar189._8_4_ = auVar119._8_4_ * auVar112._8_4_;
      auVar189._12_4_ = auVar119._12_4_ * auVar112._12_4_;
      auVar189._16_4_ = fVar163 * auVar112._16_4_;
      auVar189._20_4_ = fVar173 * auVar112._20_4_;
      auVar189._24_4_ = fVar172 * auVar112._24_4_;
      auVar189._28_4_ = 0;
      auVar92 = vfmsub231ps_fma(auVar189,auVar111,auVar118);
      auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar106,auVar108);
      auVar101 = vfmadd231ps_avx512vl(auVar108,auVar106,ZEXT1632(auVar89));
      auVar194 = ZEXT3264(auVar101);
      auVar108 = vmaxps_avx(auVar100,auVar101);
      uVar159 = vcmpps_avx512vl(auVar108,auVar106,2);
      bVar72 = bVar72 & (byte)uVar159;
      if (bVar72 != 0) {
        auVar32._4_4_ = auVar98._4_4_ * auVar110._4_4_;
        auVar32._0_4_ = auVar98._0_4_ * auVar110._0_4_;
        auVar32._8_4_ = auVar98._8_4_ * auVar110._8_4_;
        auVar32._12_4_ = auVar98._12_4_ * auVar110._12_4_;
        auVar32._16_4_ = auVar98._16_4_ * auVar110._16_4_;
        auVar32._20_4_ = auVar98._20_4_ * auVar110._20_4_;
        auVar32._24_4_ = auVar98._24_4_ * auVar110._24_4_;
        auVar32._28_4_ = auVar108._28_4_;
        auVar19 = vfmsub231ps_fma(auVar32,auVar111,auVar114);
        auVar33._4_4_ = auVar114._4_4_ * auVar112._4_4_;
        auVar33._0_4_ = auVar114._0_4_ * auVar112._0_4_;
        auVar33._8_4_ = auVar114._8_4_ * auVar112._8_4_;
        auVar33._12_4_ = auVar114._12_4_ * auVar112._12_4_;
        auVar33._16_4_ = auVar114._16_4_ * auVar112._16_4_;
        auVar33._20_4_ = auVar114._20_4_ * auVar112._20_4_;
        auVar33._24_4_ = auVar114._24_4_ * auVar112._24_4_;
        auVar33._28_4_ = auVar114._28_4_;
        auVar91 = vfmsub231ps_fma(auVar33,auVar109,auVar98);
        auVar34._4_4_ = auVar111._4_4_ * auVar109._4_4_;
        auVar34._0_4_ = auVar111._0_4_ * auVar109._0_4_;
        auVar34._8_4_ = auVar111._8_4_ * auVar109._8_4_;
        auVar34._12_4_ = auVar111._12_4_ * auVar109._12_4_;
        auVar34._16_4_ = auVar111._16_4_ * auVar109._16_4_;
        auVar34._20_4_ = auVar111._20_4_ * auVar109._20_4_;
        auVar34._24_4_ = auVar111._24_4_ * auVar109._24_4_;
        auVar34._28_4_ = auVar111._28_4_;
        auVar85 = vfmsub231ps_fma(auVar34,auVar112,auVar110);
        auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar85));
        auVar92 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar19),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar108 = vrcp14ps_avx512vl(ZEXT1632(auVar92));
        auVar25._8_4_ = 0x3f800000;
        auVar25._0_8_ = 0x3f8000003f800000;
        auVar25._12_4_ = 0x3f800000;
        auVar25._16_4_ = 0x3f800000;
        auVar25._20_4_ = 0x3f800000;
        auVar25._24_4_ = 0x3f800000;
        auVar25._28_4_ = 0x3f800000;
        auVar110 = vfnmadd213ps_avx512vl(auVar108,ZEXT1632(auVar92),auVar25);
        auVar89 = vfmadd132ps_fma(auVar110,auVar108,auVar108);
        auVar203 = ZEXT1664(auVar89);
        auVar35._4_4_ = auVar85._4_4_ * auVar117._4_4_;
        auVar35._0_4_ = auVar85._0_4_ * auVar117._0_4_;
        auVar35._8_4_ = auVar85._8_4_ * auVar117._8_4_;
        auVar35._12_4_ = auVar85._12_4_ * auVar117._12_4_;
        auVar35._16_4_ = fVar211 * 0.0;
        auVar35._20_4_ = fVar208 * 0.0;
        auVar35._24_4_ = fVar210 * 0.0;
        auVar35._28_4_ = iVar1;
        auVar91 = vfmadd231ps_fma(auVar35,auVar113,ZEXT1632(auVar91));
        auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar99,ZEXT1632(auVar19));
        fVar208 = auVar89._0_4_;
        fVar210 = auVar89._4_4_;
        fVar211 = auVar89._8_4_;
        fVar173 = auVar89._12_4_;
        fStack_584 = (float)auVar108._28_4_;
        _local_5a0 = ZEXT1628(CONCAT412(auVar91._12_4_ * fVar173,
                                        CONCAT48(auVar91._8_4_ * fVar211,
                                                 CONCAT44(auVar91._4_4_ * fVar210,
                                                          auVar91._0_4_ * fVar208))));
        auVar206 = ZEXT3264(_local_5a0);
        auVar150._4_4_ = local_560;
        auVar150._0_4_ = local_560;
        auVar150._8_4_ = local_560;
        auVar150._12_4_ = local_560;
        auVar150._16_4_ = local_560;
        auVar150._20_4_ = local_560;
        auVar150._24_4_ = local_560;
        auVar150._28_4_ = local_560;
        uVar159 = vcmpps_avx512vl(auVar150,_local_5a0,2);
        uVar158 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar26._4_4_ = uVar158;
        auVar26._0_4_ = uVar158;
        auVar26._8_4_ = uVar158;
        auVar26._12_4_ = uVar158;
        auVar26._16_4_ = uVar158;
        auVar26._20_4_ = uVar158;
        auVar26._24_4_ = uVar158;
        auVar26._28_4_ = uVar158;
        uVar22 = vcmpps_avx512vl(_local_5a0,auVar26,2);
        bVar72 = (byte)uVar159 & (byte)uVar22 & bVar72;
        if (bVar72 != 0) {
          uVar73 = vcmpps_avx512vl(ZEXT1632(auVar92),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar73 = bVar72 & uVar73;
          if ((char)uVar73 != '\0') {
            fVar163 = auVar100._0_4_ * fVar208;
            fVar172 = auVar100._4_4_ * fVar210;
            auVar36._4_4_ = fVar172;
            auVar36._0_4_ = fVar163;
            fVar74 = auVar100._8_4_ * fVar211;
            auVar36._8_4_ = fVar74;
            fVar75 = auVar100._12_4_ * fVar173;
            auVar36._12_4_ = fVar75;
            fVar138 = auVar100._16_4_ * 0.0;
            auVar36._16_4_ = fVar138;
            fVar139 = auVar100._20_4_ * 0.0;
            auVar36._20_4_ = fVar139;
            fVar140 = auVar100._24_4_ * 0.0;
            auVar36._24_4_ = fVar140;
            auVar36._28_4_ = auVar100._28_4_;
            auVar151._8_4_ = 0x3f800000;
            auVar151._0_8_ = 0x3f8000003f800000;
            auVar151._12_4_ = 0x3f800000;
            auVar151._16_4_ = 0x3f800000;
            auVar151._20_4_ = 0x3f800000;
            auVar151._24_4_ = 0x3f800000;
            auVar151._28_4_ = 0x3f800000;
            auVar108 = vsubps_avx(auVar151,auVar36);
            local_440._0_4_ =
                 (float)((uint)(bVar63 & 1) * (int)fVar163 |
                        (uint)!(bool)(bVar63 & 1) * auVar108._0_4_);
            bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
            local_440._4_4_ = (float)((uint)bVar12 * (int)fVar172 | (uint)!bVar12 * auVar108._4_4_);
            bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
            local_440._8_4_ = (float)((uint)bVar12 * (int)fVar74 | (uint)!bVar12 * auVar108._8_4_);
            bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
            local_440._12_4_ = (float)((uint)bVar12 * (int)fVar75 | (uint)!bVar12 * auVar108._12_4_)
            ;
            bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
            local_440._16_4_ =
                 (float)((uint)bVar12 * (int)fVar138 | (uint)!bVar12 * auVar108._16_4_);
            bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
            local_440._20_4_ =
                 (float)((uint)bVar12 * (int)fVar139 | (uint)!bVar12 * auVar108._20_4_);
            bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
            local_440._24_4_ =
                 (float)((uint)bVar12 * (int)fVar140 | (uint)!bVar12 * auVar108._24_4_);
            bVar12 = SUB81(uVar64 >> 7,0);
            local_440._28_4_ =
                 (float)((uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * auVar108._28_4_);
            auVar108 = vsubps_avx(ZEXT1632(auVar84),auVar105);
            auVar89 = vfmadd213ps_fma(auVar108,local_440,auVar105);
            uVar158 = *(undefined4 *)((long)local_610->ray_space + k * 4 + -0x20);
            auVar105._4_4_ = uVar158;
            auVar105._0_4_ = uVar158;
            auVar105._8_4_ = uVar158;
            auVar105._12_4_ = uVar158;
            auVar105._16_4_ = uVar158;
            auVar105._20_4_ = uVar158;
            auVar105._24_4_ = uVar158;
            auVar105._28_4_ = uVar158;
            auVar108 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar89._12_4_ + auVar89._12_4_,
                                                          CONCAT48(auVar89._8_4_ + auVar89._8_4_,
                                                                   CONCAT44(auVar89._4_4_ +
                                                                            auVar89._4_4_,
                                                                            auVar89._0_4_ +
                                                                            auVar89._0_4_)))),
                                       auVar105);
            uVar21 = vcmpps_avx512vl(_local_5a0,auVar108,6);
            uVar73 = uVar73 & uVar21;
            bVar72 = (byte)uVar73;
            if (bVar72 != 0) {
              auVar170._0_4_ = auVar101._0_4_ * fVar208;
              auVar170._4_4_ = auVar101._4_4_ * fVar210;
              auVar170._8_4_ = auVar101._8_4_ * fVar211;
              auVar170._12_4_ = auVar101._12_4_ * fVar173;
              auVar170._16_4_ = auVar101._16_4_ * 0.0;
              auVar170._20_4_ = auVar101._20_4_ * 0.0;
              auVar170._24_4_ = auVar101._24_4_ * 0.0;
              auVar170._28_4_ = 0;
              auVar183._8_4_ = 0x3f800000;
              auVar183._0_8_ = 0x3f8000003f800000;
              auVar183._12_4_ = 0x3f800000;
              auVar183._16_4_ = 0x3f800000;
              auVar183._20_4_ = 0x3f800000;
              auVar183._24_4_ = 0x3f800000;
              auVar183._28_4_ = 0x3f800000;
              auVar108 = vsubps_avx(auVar183,auVar170);
              auVar123._0_4_ =
                   (uint)(bVar63 & 1) * (int)auVar170._0_4_ |
                   (uint)!(bool)(bVar63 & 1) * auVar108._0_4_;
              bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
              auVar123._4_4_ = (uint)bVar12 * (int)auVar170._4_4_ | (uint)!bVar12 * auVar108._4_4_;
              bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
              auVar123._8_4_ = (uint)bVar12 * (int)auVar170._8_4_ | (uint)!bVar12 * auVar108._8_4_;
              bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
              auVar123._12_4_ =
                   (uint)bVar12 * (int)auVar170._12_4_ | (uint)!bVar12 * auVar108._12_4_;
              bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
              auVar123._16_4_ =
                   (uint)bVar12 * (int)auVar170._16_4_ | (uint)!bVar12 * auVar108._16_4_;
              bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
              auVar123._20_4_ =
                   (uint)bVar12 * (int)auVar170._20_4_ | (uint)!bVar12 * auVar108._20_4_;
              bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
              auVar123._24_4_ =
                   (uint)bVar12 * (int)auVar170._24_4_ | (uint)!bVar12 * auVar108._24_4_;
              auVar123._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar108._28_4_;
              auVar27._8_4_ = 0x40000000;
              auVar27._0_8_ = 0x4000000040000000;
              auVar27._12_4_ = 0x40000000;
              auVar27._16_4_ = 0x40000000;
              auVar27._20_4_ = 0x40000000;
              auVar27._24_4_ = 0x40000000;
              auVar27._28_4_ = 0x40000000;
              local_420 = vfmsub132ps_avx512vl(auVar123,auVar183,auVar27);
              local_3e0 = 0;
              local_3d0 = local_680;
              uStack_3c8 = uStack_678;
              local_3c0 = local_6a0;
              uStack_3b8 = uStack_698;
              local_3b0 = local_6b0;
              uStack_3a8 = uStack_6a8;
              local_3a0 = local_690;
              uStack_398 = uStack_688;
              if ((pGVar68->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar164 = 1.0 / auVar104._0_4_;
                local_380[0] = fVar164 * (local_440._0_4_ + 0.0);
                local_380[1] = fVar164 * (local_440._4_4_ + 1.0);
                local_380[2] = fVar164 * (local_440._8_4_ + 2.0);
                local_380[3] = fVar164 * (local_440._12_4_ + 3.0);
                fStack_370 = fVar164 * (local_440._16_4_ + 4.0);
                fStack_36c = fVar164 * (local_440._20_4_ + 5.0);
                fStack_368 = fVar164 * (local_440._24_4_ + 6.0);
                fStack_364 = local_440._28_4_ + 7.0;
                local_360 = local_420;
                local_340 = _local_5a0;
                auVar152._8_4_ = 0x7f800000;
                auVar152._0_8_ = 0x7f8000007f800000;
                auVar152._12_4_ = 0x7f800000;
                auVar152._16_4_ = 0x7f800000;
                auVar152._20_4_ = 0x7f800000;
                auVar152._24_4_ = 0x7f800000;
                auVar152._28_4_ = 0x7f800000;
                auVar108 = vblendmps_avx512vl(auVar152,_local_5a0);
                auVar124._0_4_ =
                     (uint)(bVar72 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar72 & 1) * 0x7f800000;
                bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                auVar124._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                auVar124._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
                auVar124._12_4_ = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
                auVar124._16_4_ = (uint)bVar12 * auVar108._16_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
                auVar124._20_4_ = (uint)bVar12 * auVar108._20_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
                auVar124._24_4_ = (uint)bVar12 * auVar108._24_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = SUB81(uVar73 >> 7,0);
                auVar124._28_4_ = (uint)bVar12 * auVar108._28_4_ | (uint)!bVar12 * 0x7f800000;
                auVar108 = vshufps_avx(auVar124,auVar124,0xb1);
                auVar108 = vminps_avx(auVar124,auVar108);
                auVar110 = vshufpd_avx(auVar108,auVar108,5);
                auVar108 = vminps_avx(auVar108,auVar110);
                auVar110 = vpermpd_avx2(auVar108,0x4e);
                auVar108 = vminps_avx(auVar108,auVar110);
                uVar159 = vcmpps_avx512vl(auVar124,auVar108,0);
                uVar65 = (uint)uVar73;
                if ((bVar72 & (byte)uVar159) != 0) {
                  uVar65 = (uint)(bVar72 & (byte)uVar159);
                }
                uVar23 = 0;
                for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
                  uVar23 = uVar23 + 1;
                }
                uVar64 = (ulong)uVar23;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar68->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_580._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                  local_400 = _local_5a0;
                  local_3dc = iVar7;
                  do {
                    local_1c0 = local_380[uVar64];
                    local_1a0 = *(undefined4 *)(local_360 + uVar64 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar64 * 4);
                    local_670.context = context->user;
                    fVar208 = 1.0 - local_1c0;
                    fVar164 = fVar208 * fVar208 * -3.0;
                    auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * fVar208)),
                                              ZEXT416((uint)(local_1c0 * fVar208)),
                                              ZEXT416(0xc0000000));
                    auVar92 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar208)),
                                              ZEXT416((uint)(local_1c0 * local_1c0)),
                                              ZEXT416(0x40000000));
                    fVar208 = auVar89._0_4_ * 3.0;
                    fVar210 = auVar92._0_4_ * 3.0;
                    fVar211 = local_1c0 * local_1c0 * 3.0;
                    auVar199._0_4_ = fVar211 * fVar20;
                    auVar199._4_4_ = fVar211 * fVar54;
                    auVar199._8_4_ = fVar211 * fVar55;
                    auVar199._12_4_ = fVar211 * fVar62;
                    auVar148._4_4_ = fVar210;
                    auVar148._0_4_ = fVar210;
                    auVar148._8_4_ = fVar210;
                    auVar148._12_4_ = fVar210;
                    auVar89 = vfmadd132ps_fma(auVar148,auVar199,auVar88);
                    auVar182._4_4_ = fVar208;
                    auVar182._0_4_ = fVar208;
                    auVar182._8_4_ = fVar208;
                    auVar182._12_4_ = fVar208;
                    auVar89 = vfmadd132ps_fma(auVar182,auVar89,auVar87);
                    auVar149._4_4_ = fVar164;
                    auVar149._0_4_ = fVar164;
                    auVar149._8_4_ = fVar164;
                    auVar149._12_4_ = fVar164;
                    auVar89 = vfmadd132ps_fma(auVar149,auVar89,auVar90);
                    local_220 = auVar89._0_4_;
                    auVar193._8_4_ = 1;
                    auVar193._0_8_ = 0x100000001;
                    auVar193._12_4_ = 1;
                    auVar193._16_4_ = 1;
                    auVar193._20_4_ = 1;
                    auVar193._24_4_ = 1;
                    auVar193._28_4_ = 1;
                    local_200 = vpermps_avx2(auVar193,ZEXT1632(auVar89));
                    auVar194 = ZEXT3264(local_200);
                    auVar200._8_4_ = 2;
                    auVar200._0_8_ = 0x200000002;
                    auVar200._12_4_ = 2;
                    auVar202._16_4_ = 2;
                    auVar202._0_16_ = auVar200;
                    auVar202._20_4_ = 2;
                    auVar202._24_4_ = 2;
                    auVar202._28_4_ = 2;
                    auVar203 = ZEXT3264(auVar202);
                    local_1e0 = vpermps_avx2(auVar202,ZEXT1632(auVar89));
                    iStack_21c = local_220;
                    iStack_218 = local_220;
                    iStack_214 = local_220;
                    iStack_210 = local_220;
                    iStack_20c = local_220;
                    iStack_208 = local_220;
                    iStack_204 = local_220;
                    fStack_1bc = local_1c0;
                    fStack_1b8 = local_1c0;
                    fStack_1b4 = local_1c0;
                    fStack_1b0 = local_1c0;
                    fStack_1ac = local_1c0;
                    fStack_1a8 = local_1c0;
                    fStack_1a4 = local_1c0;
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = local_2e0._0_8_;
                    uStack_178 = local_2e0._8_8_;
                    uStack_170 = local_2e0._16_8_;
                    uStack_168 = local_2e0._24_8_;
                    local_160 = local_2c0;
                    auVar108 = vpcmpeqd_avx2(local_2c0,local_2c0);
                    local_618[1] = auVar108;
                    *local_618 = auVar108;
                    local_140 = (local_670.context)->instID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_120 = (local_670.context)->instPrimID[0];
                    uStack_11c = local_120;
                    uStack_118 = local_120;
                    uStack_114 = local_120;
                    uStack_110 = local_120;
                    uStack_10c = local_120;
                    uStack_108 = local_120;
                    uStack_104 = local_120;
                    local_600 = local_300;
                    local_670.valid = (int *)local_600;
                    local_670.geometryUserPtr = pGVar68->userPtr;
                    local_670.hit = (RTCHitN *)&local_220;
                    local_670.N = 8;
                    local_670.ray = (RTCRayN *)ray;
                    if (pGVar68->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar194 = ZEXT1664(local_200._0_16_);
                      auVar203 = ZEXT1664(auVar200);
                      (*pGVar68->intersectionFilterN)(&local_670);
                      auVar206 = ZEXT3264(_local_5a0);
                      auVar89 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
                      auVar228 = ZEXT1664(auVar89);
                      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar227 = ZEXT1664(auVar89);
                      k = local_620;
                    }
                    if (local_600 == (undefined1  [32])0x0) {
LAB_019227bf:
                      *(undefined4 *)(ray + k * 4 + 0x100) = local_580._0_4_;
                    }
                    else {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar68->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar194 = ZEXT1664(auVar194._0_16_);
                        auVar203 = ZEXT1664(auVar203._0_16_);
                        (*p_Var11)(&local_670);
                        auVar206 = ZEXT3264(_local_5a0);
                        auVar89 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
                        auVar228 = ZEXT1664(auVar89);
                        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar227 = ZEXT1664(auVar89);
                        k = local_620;
                      }
                      if (local_600 == (undefined1  [32])0x0) goto LAB_019227bf;
                      uVar21 = vptestmd_avx512vl(local_600,local_600);
                      iVar1 = *(int *)(local_670.hit + 4);
                      iVar2 = *(int *)(local_670.hit + 8);
                      iVar56 = *(int *)(local_670.hit + 0xc);
                      iVar57 = *(int *)(local_670.hit + 0x10);
                      iVar58 = *(int *)(local_670.hit + 0x14);
                      iVar59 = *(int *)(local_670.hit + 0x18);
                      iVar60 = *(int *)(local_670.hit + 0x1c);
                      bVar72 = (byte)uVar21;
                      bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
                      bVar18 = SUB81(uVar21 >> 7,0);
                      *(uint *)(local_670.ray + 0x180) =
                           (uint)(bVar72 & 1) * *(int *)local_670.hit |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_670.ray + 0x180);
                      *(uint *)(local_670.ray + 0x184) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_670.ray + 0x184);
                      *(uint *)(local_670.ray + 0x188) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_670.ray + 0x188);
                      *(uint *)(local_670.ray + 0x18c) =
                           (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_670.ray + 0x18c);
                      *(uint *)(local_670.ray + 400) =
                           (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_670.ray + 400);
                      *(uint *)(local_670.ray + 0x194) =
                           (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_670.ray + 0x194);
                      *(uint *)(local_670.ray + 0x198) =
                           (uint)bVar17 * iVar59 | (uint)!bVar17 * *(int *)(local_670.ray + 0x198);
                      *(uint *)(local_670.ray + 0x19c) =
                           (uint)bVar18 * iVar60 | (uint)!bVar18 * *(int *)(local_670.ray + 0x19c);
                      iVar1 = *(int *)(local_670.hit + 0x24);
                      iVar2 = *(int *)(local_670.hit + 0x28);
                      iVar56 = *(int *)(local_670.hit + 0x2c);
                      iVar57 = *(int *)(local_670.hit + 0x30);
                      iVar58 = *(int *)(local_670.hit + 0x34);
                      iVar59 = *(int *)(local_670.hit + 0x38);
                      iVar60 = *(int *)(local_670.hit + 0x3c);
                      bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
                      bVar18 = SUB81(uVar21 >> 7,0);
                      *(uint *)(local_670.ray + 0x1a0) =
                           (uint)(bVar72 & 1) * *(int *)(local_670.hit + 0x20) |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_670.ray + 0x1a0);
                      *(uint *)(local_670.ray + 0x1a4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_670.ray + 0x1a4);
                      *(uint *)(local_670.ray + 0x1a8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1a8);
                      *(uint *)(local_670.ray + 0x1ac) =
                           (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1ac);
                      *(uint *)(local_670.ray + 0x1b0) =
                           (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1b0);
                      *(uint *)(local_670.ray + 0x1b4) =
                           (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1b4);
                      *(uint *)(local_670.ray + 0x1b8) =
                           (uint)bVar17 * iVar59 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1b8);
                      *(uint *)(local_670.ray + 0x1bc) =
                           (uint)bVar18 * iVar60 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1bc);
                      iVar1 = *(int *)(local_670.hit + 0x44);
                      iVar2 = *(int *)(local_670.hit + 0x48);
                      iVar56 = *(int *)(local_670.hit + 0x4c);
                      iVar57 = *(int *)(local_670.hit + 0x50);
                      iVar58 = *(int *)(local_670.hit + 0x54);
                      iVar59 = *(int *)(local_670.hit + 0x58);
                      iVar60 = *(int *)(local_670.hit + 0x5c);
                      bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
                      bVar18 = SUB81(uVar21 >> 7,0);
                      *(uint *)(local_670.ray + 0x1c0) =
                           (uint)(bVar72 & 1) * *(int *)(local_670.hit + 0x40) |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_670.ray + 0x1c0);
                      *(uint *)(local_670.ray + 0x1c4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_670.ray + 0x1c4);
                      *(uint *)(local_670.ray + 0x1c8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1c8);
                      *(uint *)(local_670.ray + 0x1cc) =
                           (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1cc);
                      *(uint *)(local_670.ray + 0x1d0) =
                           (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1d0);
                      *(uint *)(local_670.ray + 0x1d4) =
                           (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1d4);
                      *(uint *)(local_670.ray + 0x1d8) =
                           (uint)bVar17 * iVar59 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1d8);
                      *(uint *)(local_670.ray + 0x1dc) =
                           (uint)bVar18 * iVar60 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1dc);
                      iVar1 = *(int *)(local_670.hit + 100);
                      iVar2 = *(int *)(local_670.hit + 0x68);
                      iVar56 = *(int *)(local_670.hit + 0x6c);
                      iVar57 = *(int *)(local_670.hit + 0x70);
                      iVar58 = *(int *)(local_670.hit + 0x74);
                      iVar59 = *(int *)(local_670.hit + 0x78);
                      iVar60 = *(int *)(local_670.hit + 0x7c);
                      bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
                      bVar18 = SUB81(uVar21 >> 7,0);
                      *(uint *)(local_670.ray + 0x1e0) =
                           (uint)(bVar72 & 1) * *(int *)(local_670.hit + 0x60) |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_670.ray + 0x1e0);
                      *(uint *)(local_670.ray + 0x1e4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_670.ray + 0x1e4);
                      *(uint *)(local_670.ray + 0x1e8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1e8);
                      *(uint *)(local_670.ray + 0x1ec) =
                           (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1ec);
                      *(uint *)(local_670.ray + 0x1f0) =
                           (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1f0);
                      *(uint *)(local_670.ray + 500) =
                           (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_670.ray + 500);
                      *(uint *)(local_670.ray + 0x1f8) =
                           (uint)bVar17 * iVar59 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1f8);
                      *(uint *)(local_670.ray + 0x1fc) =
                           (uint)bVar18 * iVar60 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1fc);
                      iVar1 = *(int *)(local_670.hit + 0x84);
                      iVar2 = *(int *)(local_670.hit + 0x88);
                      iVar56 = *(int *)(local_670.hit + 0x8c);
                      iVar57 = *(int *)(local_670.hit + 0x90);
                      iVar58 = *(int *)(local_670.hit + 0x94);
                      iVar59 = *(int *)(local_670.hit + 0x98);
                      iVar60 = *(int *)(local_670.hit + 0x9c);
                      bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
                      bVar18 = SUB81(uVar21 >> 7,0);
                      *(uint *)(local_670.ray + 0x200) =
                           (uint)(bVar72 & 1) * *(int *)(local_670.hit + 0x80) |
                           (uint)!(bool)(bVar72 & 1) * *(int *)(local_670.ray + 0x200);
                      *(uint *)(local_670.ray + 0x204) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_670.ray + 0x204);
                      *(uint *)(local_670.ray + 0x208) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_670.ray + 0x208);
                      *(uint *)(local_670.ray + 0x20c) =
                           (uint)bVar14 * iVar56 | (uint)!bVar14 * *(int *)(local_670.ray + 0x20c);
                      *(uint *)(local_670.ray + 0x210) =
                           (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_670.ray + 0x210);
                      *(uint *)(local_670.ray + 0x214) =
                           (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_670.ray + 0x214);
                      *(uint *)(local_670.ray + 0x218) =
                           (uint)bVar17 * iVar59 | (uint)!bVar17 * *(int *)(local_670.ray + 0x218);
                      *(uint *)(local_670.ray + 0x21c) =
                           (uint)bVar18 * iVar60 | (uint)!bVar18 * *(int *)(local_670.ray + 0x21c);
                      auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xa0));
                      *(undefined1 (*) [32])(local_670.ray + 0x220) = auVar108;
                      auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xc0));
                      *(undefined1 (*) [32])(local_670.ray + 0x240) = auVar108;
                      auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xe0));
                      *(undefined1 (*) [32])(local_670.ray + 0x260) = auVar108;
                      auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0x100));
                      *(undefined1 (*) [32])(local_670.ray + 0x280) = auVar108;
                      local_580._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_580._4_4_ = 0;
                      local_580._8_4_ = 0;
                      local_580._12_4_ = 0;
                    }
                    bVar72 = ~(byte)(1 << ((uint)uVar64 & 0x1f)) & (byte)uVar73;
                    auVar156._4_4_ = local_580._0_4_;
                    auVar156._0_4_ = local_580._0_4_;
                    auVar156._8_4_ = local_580._0_4_;
                    auVar156._12_4_ = local_580._0_4_;
                    auVar156._16_4_ = local_580._0_4_;
                    auVar156._20_4_ = local_580._0_4_;
                    auVar156._24_4_ = local_580._0_4_;
                    auVar156._28_4_ = local_580._0_4_;
                    uVar159 = vcmpps_avx512vl(auVar206._0_32_,auVar156,2);
                    if ((bVar72 & (byte)uVar159) == 0) goto LAB_0192175f;
                    bVar72 = bVar72 & (byte)uVar159;
                    uVar73 = (ulong)bVar72;
                    auVar157._8_4_ = 0x7f800000;
                    auVar157._0_8_ = 0x7f8000007f800000;
                    auVar157._12_4_ = 0x7f800000;
                    auVar157._16_4_ = 0x7f800000;
                    auVar157._20_4_ = 0x7f800000;
                    auVar157._24_4_ = 0x7f800000;
                    auVar157._28_4_ = 0x7f800000;
                    auVar108 = vblendmps_avx512vl(auVar157,auVar206._0_32_);
                    auVar137._0_4_ =
                         (uint)(bVar72 & 1) * auVar108._0_4_ |
                         (uint)!(bool)(bVar72 & 1) * 0x7f800000;
                    bVar12 = (bool)(bVar72 >> 1 & 1);
                    auVar137._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar72 >> 2 & 1);
                    auVar137._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar72 >> 3 & 1);
                    auVar137._12_4_ = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar72 >> 4 & 1);
                    auVar137._16_4_ = (uint)bVar12 * auVar108._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar72 >> 5 & 1);
                    auVar137._20_4_ = (uint)bVar12 * auVar108._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar72 >> 6 & 1);
                    auVar137._24_4_ = (uint)bVar12 * auVar108._24_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar137._28_4_ =
                         (uint)(bVar72 >> 7) * auVar108._28_4_ |
                         (uint)!(bool)(bVar72 >> 7) * 0x7f800000;
                    auVar108 = vshufps_avx(auVar137,auVar137,0xb1);
                    auVar108 = vminps_avx(auVar137,auVar108);
                    auVar110 = vshufpd_avx(auVar108,auVar108,5);
                    auVar108 = vminps_avx(auVar108,auVar110);
                    auVar110 = vpermpd_avx2(auVar108,0x4e);
                    auVar108 = vminps_avx(auVar108,auVar110);
                    uVar159 = vcmpps_avx512vl(auVar137,auVar108,0);
                    bVar63 = (byte)uVar159 & bVar72;
                    if (bVar63 != 0) {
                      bVar72 = bVar63;
                    }
                    uVar71 = 0;
                    for (uVar65 = (uint)bVar72; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000
                        ) {
                      uVar71 = uVar71 + 1;
                    }
                    uVar64 = (ulong)uVar71;
                  } while( true );
                }
                fVar164 = local_380[uVar64];
                uVar158 = *(undefined4 *)(local_360 + uVar64 * 4);
                fVar210 = 1.0 - fVar164;
                fVar208 = fVar210 * fVar210 * -3.0;
                auVar194 = ZEXT464((uint)fVar208);
                auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * fVar210)),
                                          ZEXT416((uint)(fVar164 * fVar210)),ZEXT416(0xc0000000));
                auVar92 = vfmsub132ss_fma(ZEXT416((uint)(fVar164 * fVar210)),
                                          ZEXT416((uint)(fVar164 * fVar164)),ZEXT416(0x40000000));
                fVar210 = auVar89._0_4_ * 3.0;
                fVar211 = auVar92._0_4_ * 3.0;
                fVar173 = fVar164 * fVar164 * 3.0;
                auVar195._0_4_ = fVar173 * fVar20;
                auVar195._4_4_ = fVar173 * fVar54;
                auVar195._8_4_ = fVar173 * fVar55;
                auVar195._12_4_ = fVar173 * fVar62;
                auVar203 = ZEXT1664(auVar195);
                auVar166._4_4_ = fVar211;
                auVar166._0_4_ = fVar211;
                auVar166._8_4_ = fVar211;
                auVar166._12_4_ = fVar211;
                auVar89 = vfmadd132ps_fma(auVar166,auVar195,auVar88);
                auVar179._4_4_ = fVar210;
                auVar179._0_4_ = fVar210;
                auVar179._8_4_ = fVar210;
                auVar179._12_4_ = fVar210;
                auVar89 = vfmadd132ps_fma(auVar179,auVar89,auVar87);
                auVar167._4_4_ = fVar208;
                auVar167._0_4_ = fVar208;
                auVar167._8_4_ = fVar208;
                auVar167._12_4_ = fVar208;
                auVar89 = vfmadd132ps_fma(auVar167,auVar89,auVar90);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar64 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar89._0_4_;
                uVar8 = vextractps_avx(auVar89,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                uVar8 = vextractps_avx(auVar89,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar8;
                *(float *)(ray + k * 4 + 0x1e0) = fVar164;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar158;
                *(uint *)(ray + k * 4 + 0x220) = uVar71;
                *(uint *)(ray + k * 4 + 0x240) = uVar6;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_0192175f:
                fVar164 = (float)local_640._0_4_;
              }
            }
          }
        }
      }
    }
    local_640._0_4_ = fVar164;
    if (8 < iVar7) {
      local_580 = vpbroadcastd_avx512vl();
      local_5a0._4_4_ = local_640._0_4_;
      local_5a0._0_4_ = local_640._0_4_;
      fStack_598 = (float)local_640._0_4_;
      fStack_594 = (float)local_640._0_4_;
      fStack_590 = (float)local_640._0_4_;
      fStack_58c = (float)local_640._0_4_;
      fStack_588 = (float)local_640._0_4_;
      fStack_584 = (float)local_640._0_4_;
      uStack_55c = local_560;
      uStack_558 = local_560;
      uStack_554 = local_560;
      uStack_550 = local_560;
      uStack_54c = local_560;
      uStack_548 = local_560;
      uStack_544 = local_560;
      local_100 = 1.0 / (float)local_5c0._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      lVar67 = 8;
LAB_019217ee:
      if (lVar67 < lVar69) {
        auVar108 = vpbroadcastd_avx512vl();
        auVar108 = vpor_avx2(auVar108,_DAT_01fb4ba0);
        uVar22 = vpcmpd_avx512vl(auVar108,local_580,1);
        auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 * 4 + lVar70);
        auVar110 = *(undefined1 (*) [32])(lVar70 + 0x21fb768 + lVar67 * 4);
        auVar114 = *(undefined1 (*) [32])(lVar70 + 0x21fbbec + lVar67 * 4);
        auVar112 = *(undefined1 (*) [32])(lVar70 + 0x21fc070 + lVar67 * 4);
        auVar204._0_4_ = auVar112._0_4_ * (float)local_520._0_4_;
        auVar204._4_4_ = auVar112._4_4_ * (float)local_520._4_4_;
        auVar204._8_4_ = auVar112._8_4_ * fStack_518;
        auVar204._12_4_ = auVar112._12_4_ * fStack_514;
        auVar204._16_4_ = auVar112._16_4_ * fStack_510;
        auVar204._20_4_ = auVar112._20_4_ * fStack_50c;
        auVar204._28_36_ = auVar203._28_36_;
        auVar204._24_4_ = auVar112._24_4_ * fStack_508;
        auVar203._0_4_ = auVar112._0_4_ * (float)local_540._0_4_;
        auVar203._4_4_ = auVar112._4_4_ * (float)local_540._4_4_;
        auVar203._8_4_ = auVar112._8_4_ * fStack_538;
        auVar203._12_4_ = auVar112._12_4_ * fStack_534;
        auVar203._16_4_ = auVar112._16_4_ * fStack_530;
        auVar203._20_4_ = auVar112._20_4_ * fStack_52c;
        auVar203._28_36_ = auVar194._28_36_;
        auVar203._24_4_ = auVar112._24_4_ * fStack_528;
        auVar111 = vmulps_avx512vl(local_e0,auVar112);
        auVar98 = vfmadd231ps_avx512vl(auVar204._0_32_,auVar114,local_4e0);
        auVar99 = vfmadd231ps_avx512vl(auVar203._0_32_,auVar114,local_500);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar114,local_c0);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar110,local_4a0);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar110,local_4c0);
        auVar113 = vfmadd231ps_avx512vl(auVar111,auVar110,local_a0);
        auVar89 = vfmadd231ps_fma(auVar98,auVar108,local_460);
        auVar203 = ZEXT1664(auVar89);
        auVar92 = vfmadd231ps_fma(auVar99,auVar108,local_480);
        auVar194 = ZEXT1664(auVar92);
        auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 * 4 + lVar70);
        auVar98 = *(undefined1 (*) [32])(lVar70 + 0x21fdb88 + lVar67 * 4);
        auVar101 = vfmadd231ps_avx512vl(auVar113,auVar108,local_80);
        auVar99 = *(undefined1 (*) [32])(lVar70 + 0x21fe00c + lVar67 * 4);
        auVar113 = *(undefined1 (*) [32])(lVar70 + 0x21fe490 + lVar67 * 4);
        auVar207._0_4_ = auVar113._0_4_ * (float)local_520._0_4_;
        auVar207._4_4_ = auVar113._4_4_ * (float)local_520._4_4_;
        auVar207._8_4_ = auVar113._8_4_ * fStack_518;
        auVar207._12_4_ = auVar113._12_4_ * fStack_514;
        auVar207._16_4_ = auVar113._16_4_ * fStack_510;
        auVar207._20_4_ = auVar113._20_4_ * fStack_50c;
        auVar207._28_36_ = auVar206._28_36_;
        auVar207._24_4_ = auVar113._24_4_ * fStack_508;
        auVar37._4_4_ = auVar113._4_4_ * (float)local_540._4_4_;
        auVar37._0_4_ = auVar113._0_4_ * (float)local_540._0_4_;
        auVar37._8_4_ = auVar113._8_4_ * fStack_538;
        auVar37._12_4_ = auVar113._12_4_ * fStack_534;
        auVar37._16_4_ = auVar113._16_4_ * fStack_530;
        auVar37._20_4_ = auVar113._20_4_ * fStack_52c;
        auVar37._24_4_ = auVar113._24_4_ * fStack_528;
        auVar37._28_4_ = uStack_524;
        auVar109 = vmulps_avx512vl(local_e0,auVar113);
        auVar100 = vfmadd231ps_avx512vl(auVar207._0_32_,auVar99,local_4e0);
        auVar102 = vfmadd231ps_avx512vl(auVar37,auVar99,local_500);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar99,local_c0);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar98,local_4a0);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,local_4c0);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar98,local_a0);
        auVar91 = vfmadd231ps_fma(auVar100,auVar111,local_460);
        auVar206 = ZEXT1664(auVar91);
        auVar19 = vfmadd231ps_fma(auVar102,auVar111,local_480);
        auVar102 = vfmadd231ps_avx512vl(auVar109,auVar111,local_80);
        auVar103 = vmaxps_avx512vl(auVar101,auVar102);
        auVar109 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar89));
        auVar100 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar92));
        auVar104 = vmulps_avx512vl(ZEXT1632(auVar92),auVar109);
        auVar105 = vmulps_avx512vl(ZEXT1632(auVar89),auVar100);
        auVar104 = vsubps_avx512vl(auVar104,auVar105);
        auVar105 = vmulps_avx512vl(auVar100,auVar100);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar109,auVar109);
        auVar103 = vmulps_avx512vl(auVar103,auVar103);
        auVar103 = vmulps_avx512vl(auVar103,auVar105);
        auVar104 = vmulps_avx512vl(auVar104,auVar104);
        uVar159 = vcmpps_avx512vl(auVar104,auVar103,2);
        bVar72 = (byte)uVar22 & (byte)uVar159;
        if (bVar72 != 0) {
          auVar113 = vmulps_avx512vl(local_2a0,auVar113);
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_280,auVar113);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_260,auVar99);
          auVar111 = vfmadd213ps_avx512vl(auVar111,local_240,auVar98);
          auVar112 = vmulps_avx512vl(local_2a0,auVar112);
          auVar114 = vfmadd213ps_avx512vl(auVar114,local_280,auVar112);
          auVar110 = vfmadd213ps_avx512vl(auVar110,local_260,auVar114);
          auVar98 = vfmadd213ps_avx512vl(auVar108,local_240,auVar110);
          auVar108 = *(undefined1 (*) [32])(lVar70 + 0x21fc4f4 + lVar67 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar70 + 0x21fc978 + lVar67 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar70 + 0x21fcdfc + lVar67 * 4);
          auVar112 = *(undefined1 (*) [32])(lVar70 + 0x21fd280 + lVar67 * 4);
          auVar99 = vmulps_avx512vl(_local_520,auVar112);
          auVar113 = vmulps_avx512vl(_local_540,auVar112);
          auVar112 = vmulps_avx512vl(local_2a0,auVar112);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar114,local_4e0);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar114,local_500);
          auVar114 = vfmadd231ps_avx512vl(auVar112,local_280,auVar114);
          auVar112 = vfmadd231ps_avx512vl(auVar99,auVar110,local_4a0);
          auVar99 = vfmadd231ps_avx512vl(auVar113,auVar110,local_4c0);
          auVar110 = vfmadd231ps_avx512vl(auVar114,local_260,auVar110);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,local_460);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_480);
          auVar113 = vfmadd231ps_avx512vl(auVar110,local_240,auVar108);
          auVar108 = *(undefined1 (*) [32])(lVar70 + 0x21fe914 + lVar67 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar70 + 0x21ff21c + lVar67 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar70 + 0x21ff6a0 + lVar67 * 4);
          auVar103 = vmulps_avx512vl(_local_520,auVar114);
          auVar104 = vmulps_avx512vl(_local_540,auVar114);
          auVar114 = vmulps_avx512vl(local_2a0,auVar114);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar110,local_4e0);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar110,local_500);
          auVar114 = vfmadd231ps_avx512vl(auVar114,local_280,auVar110);
          auVar110 = *(undefined1 (*) [32])(lVar70 + 0x21fed98 + lVar67 * 4);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar110,local_4a0);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar110,local_4c0);
          auVar110 = vfmadd231ps_avx512vl(auVar114,local_260,auVar110);
          auVar114 = vfmadd231ps_avx512vl(auVar103,auVar108,local_460);
          auVar103 = vfmadd231ps_avx512vl(auVar104,auVar108,local_480);
          auVar110 = vfmadd231ps_avx512vl(auVar110,local_240,auVar108);
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar112,auVar104);
          vandps_avx512vl(auVar99,auVar104);
          auVar108 = vmaxps_avx(auVar104,auVar104);
          vandps_avx512vl(auVar113,auVar104);
          auVar108 = vmaxps_avx(auVar108,auVar104);
          uVar64 = vcmpps_avx512vl(auVar108,_local_5a0,1);
          bVar12 = (bool)((byte)uVar64 & 1);
          auVar125._0_4_ = (float)((uint)bVar12 * auVar109._0_4_ | (uint)!bVar12 * auVar112._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * auVar112._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * auVar112._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar125._12_4_ =
               (float)((uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * auVar112._12_4_);
          bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar125._16_4_ =
               (float)((uint)bVar12 * auVar109._16_4_ | (uint)!bVar12 * auVar112._16_4_);
          bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar125._20_4_ =
               (float)((uint)bVar12 * auVar109._20_4_ | (uint)!bVar12 * auVar112._20_4_);
          bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar125._24_4_ =
               (float)((uint)bVar12 * auVar109._24_4_ | (uint)!bVar12 * auVar112._24_4_);
          bVar12 = SUB81(uVar64 >> 7,0);
          auVar125._28_4_ = (uint)bVar12 * auVar109._28_4_ | (uint)!bVar12 * auVar112._28_4_;
          bVar12 = (bool)((byte)uVar64 & 1);
          auVar126._0_4_ = (float)((uint)bVar12 * auVar100._0_4_ | (uint)!bVar12 * auVar99._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar99._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar99._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar99._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar126._16_4_ = (float)((uint)bVar12 * auVar100._16_4_ | (uint)!bVar12 * auVar99._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar126._20_4_ = (float)((uint)bVar12 * auVar100._20_4_ | (uint)!bVar12 * auVar99._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar126._24_4_ = (float)((uint)bVar12 * auVar100._24_4_ | (uint)!bVar12 * auVar99._24_4_)
          ;
          bVar12 = SUB81(uVar64 >> 7,0);
          auVar126._28_4_ = (uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * auVar99._28_4_;
          vandps_avx512vl(auVar114,auVar104);
          vandps_avx512vl(auVar103,auVar104);
          auVar108 = vmaxps_avx(auVar126,auVar126);
          vandps_avx512vl(auVar110,auVar104);
          auVar108 = vmaxps_avx(auVar108,auVar126);
          uVar64 = vcmpps_avx512vl(auVar108,_local_5a0,1);
          bVar12 = (bool)((byte)uVar64 & 1);
          auVar127._0_4_ = (uint)bVar12 * auVar109._0_4_ | (uint)!bVar12 * auVar114._0_4_;
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * auVar114._4_4_;
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * auVar114._8_4_;
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * auVar114._12_4_;
          bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar127._16_4_ = (uint)bVar12 * auVar109._16_4_ | (uint)!bVar12 * auVar114._16_4_;
          bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar127._20_4_ = (uint)bVar12 * auVar109._20_4_ | (uint)!bVar12 * auVar114._20_4_;
          bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar127._24_4_ = (uint)bVar12 * auVar109._24_4_ | (uint)!bVar12 * auVar114._24_4_;
          bVar12 = SUB81(uVar64 >> 7,0);
          auVar127._28_4_ = (uint)bVar12 * auVar109._28_4_ | (uint)!bVar12 * auVar114._28_4_;
          bVar12 = (bool)((byte)uVar64 & 1);
          auVar128._0_4_ = (float)((uint)bVar12 * auVar100._0_4_ | (uint)!bVar12 * auVar103._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar103._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar103._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar128._12_4_ =
               (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar103._12_4_);
          bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar128._16_4_ =
               (float)((uint)bVar12 * auVar100._16_4_ | (uint)!bVar12 * auVar103._16_4_);
          bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar128._20_4_ =
               (float)((uint)bVar12 * auVar100._20_4_ | (uint)!bVar12 * auVar103._20_4_);
          bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar128._24_4_ =
               (float)((uint)bVar12 * auVar100._24_4_ | (uint)!bVar12 * auVar103._24_4_);
          bVar12 = SUB81(uVar64 >> 7,0);
          auVar128._28_4_ = (uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * auVar103._28_4_;
          auVar213._8_4_ = 0x80000000;
          auVar213._0_8_ = 0x8000000080000000;
          auVar213._12_4_ = 0x80000000;
          auVar213._16_4_ = 0x80000000;
          auVar213._20_4_ = 0x80000000;
          auVar213._24_4_ = 0x80000000;
          auVar213._28_4_ = 0x80000000;
          auVar108 = vxorps_avx512vl(auVar127,auVar213);
          auVar97 = vxorps_avx512vl(auVar104._0_16_,auVar104._0_16_);
          auVar110 = vfmadd213ps_avx512vl(auVar125,auVar125,ZEXT1632(auVar97));
          auVar85 = vfmadd231ps_fma(auVar110,auVar126,auVar126);
          auVar110 = vrsqrt14ps_avx512vl(ZEXT1632(auVar85));
          auVar225._8_4_ = 0xbf000000;
          auVar225._0_8_ = 0xbf000000bf000000;
          auVar225._12_4_ = 0xbf000000;
          auVar225._16_4_ = 0xbf000000;
          auVar225._20_4_ = 0xbf000000;
          auVar225._24_4_ = 0xbf000000;
          auVar225._28_4_ = 0xbf000000;
          fVar164 = auVar110._0_4_;
          fVar208 = auVar110._4_4_;
          fVar210 = auVar110._8_4_;
          fVar211 = auVar110._12_4_;
          fVar173 = auVar110._16_4_;
          fVar163 = auVar110._20_4_;
          fVar172 = auVar110._24_4_;
          auVar38._4_4_ = fVar208 * fVar208 * fVar208 * auVar85._4_4_ * -0.5;
          auVar38._0_4_ = fVar164 * fVar164 * fVar164 * auVar85._0_4_ * -0.5;
          auVar38._8_4_ = fVar210 * fVar210 * fVar210 * auVar85._8_4_ * -0.5;
          auVar38._12_4_ = fVar211 * fVar211 * fVar211 * auVar85._12_4_ * -0.5;
          auVar38._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
          auVar38._20_4_ = fVar163 * fVar163 * fVar163 * -0.0;
          auVar38._24_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar38._28_4_ = auVar126._28_4_;
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar110 = vfmadd231ps_avx512vl(auVar38,auVar114,auVar110);
          auVar39._4_4_ = auVar126._4_4_ * auVar110._4_4_;
          auVar39._0_4_ = auVar126._0_4_ * auVar110._0_4_;
          auVar39._8_4_ = auVar126._8_4_ * auVar110._8_4_;
          auVar39._12_4_ = auVar126._12_4_ * auVar110._12_4_;
          auVar39._16_4_ = auVar126._16_4_ * auVar110._16_4_;
          auVar39._20_4_ = auVar126._20_4_ * auVar110._20_4_;
          auVar39._24_4_ = auVar126._24_4_ * auVar110._24_4_;
          auVar39._28_4_ = 0;
          auVar40._4_4_ = auVar110._4_4_ * -auVar125._4_4_;
          auVar40._0_4_ = auVar110._0_4_ * -auVar125._0_4_;
          auVar40._8_4_ = auVar110._8_4_ * -auVar125._8_4_;
          auVar40._12_4_ = auVar110._12_4_ * -auVar125._12_4_;
          auVar40._16_4_ = auVar110._16_4_ * -auVar125._16_4_;
          auVar40._20_4_ = auVar110._20_4_ * -auVar125._20_4_;
          auVar40._24_4_ = auVar110._24_4_ * -auVar125._24_4_;
          auVar40._28_4_ = auVar126._28_4_;
          auVar112 = vmulps_avx512vl(auVar110,ZEXT1632(auVar97));
          auVar113 = ZEXT1632(auVar97);
          auVar110 = vfmadd213ps_avx512vl(auVar127,auVar127,auVar113);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar128,auVar128);
          auVar99 = vrsqrt14ps_avx512vl(auVar110);
          auVar110 = vmulps_avx512vl(auVar110,auVar225);
          fVar164 = auVar99._0_4_;
          fVar208 = auVar99._4_4_;
          fVar210 = auVar99._8_4_;
          fVar211 = auVar99._12_4_;
          fVar173 = auVar99._16_4_;
          fVar163 = auVar99._20_4_;
          fVar172 = auVar99._24_4_;
          auVar41._4_4_ = fVar208 * fVar208 * fVar208 * auVar110._4_4_;
          auVar41._0_4_ = fVar164 * fVar164 * fVar164 * auVar110._0_4_;
          auVar41._8_4_ = fVar210 * fVar210 * fVar210 * auVar110._8_4_;
          auVar41._12_4_ = fVar211 * fVar211 * fVar211 * auVar110._12_4_;
          auVar41._16_4_ = fVar173 * fVar173 * fVar173 * auVar110._16_4_;
          auVar41._20_4_ = fVar163 * fVar163 * fVar163 * auVar110._20_4_;
          auVar41._24_4_ = fVar172 * fVar172 * fVar172 * auVar110._24_4_;
          auVar41._28_4_ = auVar110._28_4_;
          auVar110 = vfmadd231ps_avx512vl(auVar41,auVar114,auVar99);
          auVar42._4_4_ = auVar128._4_4_ * auVar110._4_4_;
          auVar42._0_4_ = auVar128._0_4_ * auVar110._0_4_;
          auVar42._8_4_ = auVar128._8_4_ * auVar110._8_4_;
          auVar42._12_4_ = auVar128._12_4_ * auVar110._12_4_;
          auVar42._16_4_ = auVar128._16_4_ * auVar110._16_4_;
          auVar42._20_4_ = auVar128._20_4_ * auVar110._20_4_;
          auVar42._24_4_ = auVar128._24_4_ * auVar110._24_4_;
          auVar42._28_4_ = auVar99._28_4_;
          auVar43._4_4_ = auVar110._4_4_ * auVar108._4_4_;
          auVar43._0_4_ = auVar110._0_4_ * auVar108._0_4_;
          auVar43._8_4_ = auVar110._8_4_ * auVar108._8_4_;
          auVar43._12_4_ = auVar110._12_4_ * auVar108._12_4_;
          auVar43._16_4_ = auVar110._16_4_ * auVar108._16_4_;
          auVar43._20_4_ = auVar110._20_4_ * auVar108._20_4_;
          auVar43._24_4_ = auVar110._24_4_ * auVar108._24_4_;
          auVar43._28_4_ = auVar108._28_4_;
          auVar108 = vmulps_avx512vl(auVar110,auVar113);
          auVar85 = vfmadd213ps_fma(auVar39,auVar101,ZEXT1632(auVar89));
          auVar81 = vfmadd213ps_fma(auVar40,auVar101,ZEXT1632(auVar92));
          auVar114 = vfmadd213ps_avx512vl(auVar112,auVar101,auVar98);
          auVar99 = vfmadd213ps_avx512vl(auVar42,auVar102,ZEXT1632(auVar91));
          auVar83 = vfnmadd213ps_fma(auVar39,auVar101,ZEXT1632(auVar89));
          auVar89 = vfmadd213ps_fma(auVar43,auVar102,ZEXT1632(auVar19));
          auVar84 = vfnmadd213ps_fma(auVar40,auVar101,ZEXT1632(auVar92));
          auVar92 = vfmadd213ps_fma(auVar108,auVar102,auVar111);
          auVar226 = vfnmadd231ps_fma(auVar98,auVar101,auVar112);
          auVar86 = vfnmadd213ps_fma(auVar42,auVar102,ZEXT1632(auVar91));
          auVar95 = vfnmadd213ps_fma(auVar43,auVar102,ZEXT1632(auVar19));
          auVar96 = vfnmadd231ps_fma(auVar111,auVar102,auVar108);
          auVar111 = vsubps_avx512vl(auVar99,ZEXT1632(auVar83));
          auVar108 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar84));
          auVar110 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar226));
          auVar44._4_4_ = auVar108._4_4_ * auVar226._4_4_;
          auVar44._0_4_ = auVar108._0_4_ * auVar226._0_4_;
          auVar44._8_4_ = auVar108._8_4_ * auVar226._8_4_;
          auVar44._12_4_ = auVar108._12_4_ * auVar226._12_4_;
          auVar44._16_4_ = auVar108._16_4_ * 0.0;
          auVar44._20_4_ = auVar108._20_4_ * 0.0;
          auVar44._24_4_ = auVar108._24_4_ * 0.0;
          auVar44._28_4_ = auVar112._28_4_;
          auVar91 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar84),auVar110);
          auVar45._4_4_ = auVar110._4_4_ * auVar83._4_4_;
          auVar45._0_4_ = auVar110._0_4_ * auVar83._0_4_;
          auVar45._8_4_ = auVar110._8_4_ * auVar83._8_4_;
          auVar45._12_4_ = auVar110._12_4_ * auVar83._12_4_;
          auVar45._16_4_ = auVar110._16_4_ * 0.0;
          auVar45._20_4_ = auVar110._20_4_ * 0.0;
          auVar45._24_4_ = auVar110._24_4_ * 0.0;
          auVar45._28_4_ = auVar110._28_4_;
          auVar19 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar226),auVar111);
          auVar46._4_4_ = auVar84._4_4_ * auVar111._4_4_;
          auVar46._0_4_ = auVar84._0_4_ * auVar111._0_4_;
          auVar46._8_4_ = auVar84._8_4_ * auVar111._8_4_;
          auVar46._12_4_ = auVar84._12_4_ * auVar111._12_4_;
          auVar46._16_4_ = auVar111._16_4_ * 0.0;
          auVar46._20_4_ = auVar111._20_4_ * 0.0;
          auVar46._24_4_ = auVar111._24_4_ * 0.0;
          auVar46._28_4_ = auVar111._28_4_;
          auVar82 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar83),auVar108);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar113,ZEXT1632(auVar19));
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar113,ZEXT1632(auVar91));
          auVar104 = ZEXT1632(auVar97);
          uVar64 = vcmpps_avx512vl(auVar108,auVar104,2);
          bVar63 = (byte)uVar64;
          fVar138 = (float)((uint)(bVar63 & 1) * auVar85._0_4_ |
                           (uint)!(bool)(bVar63 & 1) * auVar86._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          fVar140 = (float)((uint)bVar12 * auVar85._4_4_ | (uint)!bVar12 * auVar86._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          fVar142 = (float)((uint)bVar12 * auVar85._8_4_ | (uint)!bVar12 * auVar86._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          fVar144 = (float)((uint)bVar12 * auVar85._12_4_ | (uint)!bVar12 * auVar86._12_4_);
          auVar113 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar142,CONCAT44(fVar140,fVar138))));
          fVar139 = (float)((uint)(bVar63 & 1) * auVar81._0_4_ |
                           (uint)!(bool)(bVar63 & 1) * auVar95._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          fVar141 = (float)((uint)bVar12 * auVar81._4_4_ | (uint)!bVar12 * auVar95._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          fVar143 = (float)((uint)bVar12 * auVar81._8_4_ | (uint)!bVar12 * auVar95._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          fVar145 = (float)((uint)bVar12 * auVar81._12_4_ | (uint)!bVar12 * auVar95._12_4_);
          auVar109 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar143,CONCAT44(fVar141,fVar139))));
          auVar129._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar114._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar96._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar12 * auVar114._4_4_ | (uint)!bVar12 * auVar96._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar12 * auVar114._8_4_ | (uint)!bVar12 * auVar96._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar129._12_4_ = (float)((uint)bVar12 * auVar114._12_4_ | (uint)!bVar12 * auVar96._12_4_)
          ;
          fVar164 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar114._16_4_);
          auVar129._16_4_ = fVar164;
          fVar210 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar114._20_4_);
          auVar129._20_4_ = fVar210;
          fVar208 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar114._24_4_);
          auVar129._24_4_ = fVar208;
          iVar1 = (uint)(byte)(uVar64 >> 7) * auVar114._28_4_;
          auVar129._28_4_ = iVar1;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar83),auVar99);
          auVar130._0_4_ =
               (uint)(bVar63 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar91._0_4_;
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar91._4_4_;
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar91._8_4_;
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar91._12_4_;
          auVar130._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar108._16_4_;
          auVar130._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar108._20_4_;
          auVar130._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar108._24_4_;
          auVar130._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar108._28_4_;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar89));
          auVar131._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar108._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar85._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar131._4_4_ = (float)((uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar85._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar131._8_4_ = (float)((uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar85._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar131._12_4_ = (float)((uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar85._12_4_)
          ;
          fVar173 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar108._16_4_);
          auVar131._16_4_ = fVar173;
          fVar211 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar108._20_4_);
          auVar131._20_4_ = fVar211;
          fVar163 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar108._24_4_);
          auVar131._24_4_ = fVar163;
          auVar131._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar108._28_4_;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar226),ZEXT1632(auVar92));
          auVar132._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar108._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar81._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar132._4_4_ = (float)((uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * auVar81._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar132._8_4_ = (float)((uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * auVar81._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar132._12_4_ = (float)((uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * auVar81._12_4_)
          ;
          fVar172 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar108._16_4_);
          auVar132._16_4_ = fVar172;
          fVar74 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar108._20_4_);
          auVar132._20_4_ = fVar74;
          fVar75 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar108._24_4_);
          auVar132._24_4_ = fVar75;
          iVar2 = (uint)(byte)(uVar64 >> 7) * auVar108._28_4_;
          auVar132._28_4_ = iVar2;
          auVar133._0_4_ =
               (uint)(bVar63 & 1) * (int)auVar83._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar99._0_4_;
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar133._4_4_ = (uint)bVar12 * (int)auVar83._4_4_ | (uint)!bVar12 * auVar99._4_4_;
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar133._8_4_ = (uint)bVar12 * (int)auVar83._8_4_ | (uint)!bVar12 * auVar99._8_4_;
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar133._12_4_ = (uint)bVar12 * (int)auVar83._12_4_ | (uint)!bVar12 * auVar99._12_4_;
          auVar133._16_4_ = (uint)!(bool)((byte)(uVar64 >> 4) & 1) * auVar99._16_4_;
          auVar133._20_4_ = (uint)!(bool)((byte)(uVar64 >> 5) & 1) * auVar99._20_4_;
          auVar133._24_4_ = (uint)!(bool)((byte)(uVar64 >> 6) & 1) * auVar99._24_4_;
          auVar133._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar99._28_4_;
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar64 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar99 = vsubps_avx512vl(auVar133,auVar113);
          auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar84._12_4_ |
                                                   (uint)!bVar16 * auVar89._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar84._8_4_ |
                                                            (uint)!bVar14 * auVar89._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar84._4_4_ |
                                                                     (uint)!bVar12 * auVar89._4_4_,
                                                                     (uint)(bVar63 & 1) *
                                                                     (int)auVar84._0_4_ |
                                                                     (uint)!(bool)(bVar63 & 1) *
                                                                     auVar89._0_4_)))),auVar109);
          auVar203 = ZEXT3264(auVar110);
          auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar226._12_4_ |
                                                   (uint)!bVar17 * auVar92._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar226._8_4_ |
                                                            (uint)!bVar15 * auVar92._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar226._4_4_ |
                                                                     (uint)!bVar13 * auVar92._4_4_,
                                                                     (uint)(bVar63 & 1) *
                                                                     (int)auVar226._0_4_ |
                                                                     (uint)!(bool)(bVar63 & 1) *
                                                                     auVar92._0_4_)))),auVar129);
          auVar112 = vsubps_avx(auVar113,auVar130);
          auVar206 = ZEXT3264(auVar112);
          auVar111 = vsubps_avx(auVar109,auVar131);
          auVar98 = vsubps_avx(auVar129,auVar132);
          auVar47._4_4_ = auVar114._4_4_ * fVar140;
          auVar47._0_4_ = auVar114._0_4_ * fVar138;
          auVar47._8_4_ = auVar114._8_4_ * fVar142;
          auVar47._12_4_ = auVar114._12_4_ * fVar144;
          auVar47._16_4_ = auVar114._16_4_ * 0.0;
          auVar47._20_4_ = auVar114._20_4_ * 0.0;
          auVar47._24_4_ = auVar114._24_4_ * 0.0;
          auVar47._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar47,auVar129,auVar99);
          auVar184._0_4_ = fVar139 * auVar99._0_4_;
          auVar184._4_4_ = fVar141 * auVar99._4_4_;
          auVar184._8_4_ = fVar143 * auVar99._8_4_;
          auVar184._12_4_ = fVar145 * auVar99._12_4_;
          auVar184._16_4_ = auVar99._16_4_ * 0.0;
          auVar184._20_4_ = auVar99._20_4_ * 0.0;
          auVar184._24_4_ = auVar99._24_4_ * 0.0;
          auVar184._28_4_ = 0;
          auVar92 = vfmsub231ps_fma(auVar184,auVar113,auVar110);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar104,ZEXT1632(auVar89));
          auVar190._0_4_ = auVar110._0_4_ * auVar129._0_4_;
          auVar190._4_4_ = auVar110._4_4_ * auVar129._4_4_;
          auVar190._8_4_ = auVar110._8_4_ * auVar129._8_4_;
          auVar190._12_4_ = auVar110._12_4_ * auVar129._12_4_;
          auVar190._16_4_ = auVar110._16_4_ * fVar164;
          auVar190._20_4_ = auVar110._20_4_ * fVar210;
          auVar190._24_4_ = auVar110._24_4_ * fVar208;
          auVar190._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar190,auVar109,auVar114);
          auVar100 = vfmadd231ps_avx512vl(auVar108,auVar104,ZEXT1632(auVar89));
          auVar108 = vmulps_avx512vl(auVar98,auVar130);
          auVar108 = vfmsub231ps_avx512vl(auVar108,auVar112,auVar132);
          auVar48._4_4_ = auVar111._4_4_ * auVar132._4_4_;
          auVar48._0_4_ = auVar111._0_4_ * auVar132._0_4_;
          auVar48._8_4_ = auVar111._8_4_ * auVar132._8_4_;
          auVar48._12_4_ = auVar111._12_4_ * auVar132._12_4_;
          auVar48._16_4_ = auVar111._16_4_ * fVar172;
          auVar48._20_4_ = auVar111._20_4_ * fVar74;
          auVar48._24_4_ = auVar111._24_4_ * fVar75;
          auVar48._28_4_ = iVar2;
          auVar89 = vfmsub231ps_fma(auVar48,auVar131,auVar98);
          auVar191._0_4_ = auVar131._0_4_ * auVar112._0_4_;
          auVar191._4_4_ = auVar131._4_4_ * auVar112._4_4_;
          auVar191._8_4_ = auVar131._8_4_ * auVar112._8_4_;
          auVar191._12_4_ = auVar131._12_4_ * auVar112._12_4_;
          auVar191._16_4_ = fVar173 * auVar112._16_4_;
          auVar191._20_4_ = fVar211 * auVar112._20_4_;
          auVar191._24_4_ = fVar163 * auVar112._24_4_;
          auVar191._28_4_ = 0;
          auVar92 = vfmsub231ps_fma(auVar191,auVar111,auVar130);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar104,auVar108);
          auVar103 = vfmadd231ps_avx512vl(auVar108,auVar104,ZEXT1632(auVar89));
          auVar194 = ZEXT3264(auVar103);
          auVar108 = vmaxps_avx(auVar100,auVar103);
          uVar159 = vcmpps_avx512vl(auVar108,auVar104,2);
          bVar72 = bVar72 & (byte)uVar159;
          if (bVar72 != 0) {
            auVar49._4_4_ = auVar98._4_4_ * auVar110._4_4_;
            auVar49._0_4_ = auVar98._0_4_ * auVar110._0_4_;
            auVar49._8_4_ = auVar98._8_4_ * auVar110._8_4_;
            auVar49._12_4_ = auVar98._12_4_ * auVar110._12_4_;
            auVar49._16_4_ = auVar98._16_4_ * auVar110._16_4_;
            auVar49._20_4_ = auVar98._20_4_ * auVar110._20_4_;
            auVar49._24_4_ = auVar98._24_4_ * auVar110._24_4_;
            auVar49._28_4_ = auVar108._28_4_;
            auVar19 = vfmsub231ps_fma(auVar49,auVar111,auVar114);
            auVar50._4_4_ = auVar114._4_4_ * auVar112._4_4_;
            auVar50._0_4_ = auVar114._0_4_ * auVar112._0_4_;
            auVar50._8_4_ = auVar114._8_4_ * auVar112._8_4_;
            auVar50._12_4_ = auVar114._12_4_ * auVar112._12_4_;
            auVar50._16_4_ = auVar114._16_4_ * auVar112._16_4_;
            auVar50._20_4_ = auVar114._20_4_ * auVar112._20_4_;
            auVar50._24_4_ = auVar114._24_4_ * auVar112._24_4_;
            auVar50._28_4_ = auVar114._28_4_;
            auVar91 = vfmsub231ps_fma(auVar50,auVar99,auVar98);
            auVar51._4_4_ = auVar111._4_4_ * auVar99._4_4_;
            auVar51._0_4_ = auVar111._0_4_ * auVar99._0_4_;
            auVar51._8_4_ = auVar111._8_4_ * auVar99._8_4_;
            auVar51._12_4_ = auVar111._12_4_ * auVar99._12_4_;
            auVar51._16_4_ = auVar111._16_4_ * auVar99._16_4_;
            auVar51._20_4_ = auVar111._20_4_ * auVar99._20_4_;
            auVar51._24_4_ = auVar111._24_4_ * auVar99._24_4_;
            auVar51._28_4_ = auVar111._28_4_;
            auVar85 = vfmsub231ps_fma(auVar51,auVar112,auVar110);
            auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar85));
            auVar92 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar19),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar108 = vrcp14ps_avx512vl(ZEXT1632(auVar92));
            auVar28._8_4_ = 0x3f800000;
            auVar28._0_8_ = 0x3f8000003f800000;
            auVar28._12_4_ = 0x3f800000;
            auVar28._16_4_ = 0x3f800000;
            auVar28._20_4_ = 0x3f800000;
            auVar28._24_4_ = 0x3f800000;
            auVar28._28_4_ = 0x3f800000;
            auVar110 = vfnmadd213ps_avx512vl(auVar108,ZEXT1632(auVar92),auVar28);
            auVar89 = vfmadd132ps_fma(auVar110,auVar108,auVar108);
            auVar203 = ZEXT1664(auVar89);
            auVar52._4_4_ = auVar85._4_4_ * auVar129._4_4_;
            auVar52._0_4_ = auVar85._0_4_ * auVar129._0_4_;
            auVar52._8_4_ = auVar85._8_4_ * auVar129._8_4_;
            auVar52._12_4_ = auVar85._12_4_ * auVar129._12_4_;
            auVar52._16_4_ = fVar164 * 0.0;
            auVar52._20_4_ = fVar210 * 0.0;
            auVar52._24_4_ = fVar208 * 0.0;
            auVar52._28_4_ = iVar1;
            auVar91 = vfmadd231ps_fma(auVar52,auVar109,ZEXT1632(auVar91));
            auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar113,ZEXT1632(auVar19));
            fVar164 = auVar89._0_4_;
            fVar208 = auVar89._4_4_;
            fVar210 = auVar89._8_4_;
            fVar211 = auVar89._12_4_;
            local_400._28_4_ = auVar108._28_4_;
            local_400._0_28_ =
                 ZEXT1628(CONCAT412(auVar91._12_4_ * fVar211,
                                    CONCAT48(auVar91._8_4_ * fVar210,
                                             CONCAT44(auVar91._4_4_ * fVar208,
                                                      auVar91._0_4_ * fVar164))));
            auVar206 = ZEXT3264(local_400);
            auVar61._4_4_ = uStack_55c;
            auVar61._0_4_ = local_560;
            auVar61._8_4_ = uStack_558;
            auVar61._12_4_ = uStack_554;
            auVar61._16_4_ = uStack_550;
            auVar61._20_4_ = uStack_54c;
            auVar61._24_4_ = uStack_548;
            auVar61._28_4_ = uStack_544;
            uVar159 = vcmpps_avx512vl(local_400,auVar61,0xd);
            uVar158 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar29._4_4_ = uVar158;
            auVar29._0_4_ = uVar158;
            auVar29._8_4_ = uVar158;
            auVar29._12_4_ = uVar158;
            auVar29._16_4_ = uVar158;
            auVar29._20_4_ = uVar158;
            auVar29._24_4_ = uVar158;
            auVar29._28_4_ = uVar158;
            uVar22 = vcmpps_avx512vl(local_400,auVar29,2);
            bVar72 = (byte)uVar159 & (byte)uVar22 & bVar72;
            if (bVar72 != 0) {
              uVar73 = vcmpps_avx512vl(ZEXT1632(auVar92),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar73 = bVar72 & uVar73;
              if ((char)uVar73 != '\0') {
                fVar173 = auVar100._0_4_ * fVar164;
                fVar163 = auVar100._4_4_ * fVar208;
                auVar53._4_4_ = fVar163;
                auVar53._0_4_ = fVar173;
                fVar172 = auVar100._8_4_ * fVar210;
                auVar53._8_4_ = fVar172;
                fVar74 = auVar100._12_4_ * fVar211;
                auVar53._12_4_ = fVar74;
                fVar75 = auVar100._16_4_ * 0.0;
                auVar53._16_4_ = fVar75;
                fVar138 = auVar100._20_4_ * 0.0;
                auVar53._20_4_ = fVar138;
                fVar139 = auVar100._24_4_ * 0.0;
                auVar53._24_4_ = fVar139;
                auVar53._28_4_ = auVar100._28_4_;
                auVar171._8_4_ = 0x3f800000;
                auVar171._0_8_ = 0x3f8000003f800000;
                auVar171._12_4_ = 0x3f800000;
                auVar171._16_4_ = 0x3f800000;
                auVar171._20_4_ = 0x3f800000;
                auVar171._24_4_ = 0x3f800000;
                auVar171._28_4_ = 0x3f800000;
                auVar108 = vsubps_avx(auVar171,auVar53);
                local_440._0_4_ =
                     (float)((uint)(bVar63 & 1) * (int)fVar173 |
                            (uint)!(bool)(bVar63 & 1) * auVar108._0_4_);
                bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
                local_440._4_4_ =
                     (float)((uint)bVar12 * (int)fVar163 | (uint)!bVar12 * auVar108._4_4_);
                bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
                local_440._8_4_ =
                     (float)((uint)bVar12 * (int)fVar172 | (uint)!bVar12 * auVar108._8_4_);
                bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
                local_440._12_4_ =
                     (float)((uint)bVar12 * (int)fVar74 | (uint)!bVar12 * auVar108._12_4_);
                bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
                local_440._16_4_ =
                     (float)((uint)bVar12 * (int)fVar75 | (uint)!bVar12 * auVar108._16_4_);
                bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
                local_440._20_4_ =
                     (float)((uint)bVar12 * (int)fVar138 | (uint)!bVar12 * auVar108._20_4_);
                bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
                local_440._24_4_ =
                     (float)((uint)bVar12 * (int)fVar139 | (uint)!bVar12 * auVar108._24_4_);
                bVar12 = SUB81(uVar64 >> 7,0);
                local_440._28_4_ =
                     (float)((uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * auVar108._28_4_);
                auVar108 = vsubps_avx(auVar102,auVar101);
                auVar89 = vfmadd213ps_fma(auVar108,local_440,auVar101);
                uVar158 = *(undefined4 *)((long)local_610->ray_space + k * 4 + -0x20);
                auVar30._4_4_ = uVar158;
                auVar30._0_4_ = uVar158;
                auVar30._8_4_ = uVar158;
                auVar30._12_4_ = uVar158;
                auVar30._16_4_ = uVar158;
                auVar30._20_4_ = uVar158;
                auVar30._24_4_ = uVar158;
                auVar30._28_4_ = uVar158;
                auVar108 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar89._12_4_ + auVar89._12_4_,
                                                              CONCAT48(auVar89._8_4_ + auVar89._8_4_
                                                                       ,CONCAT44(auVar89._4_4_ +
                                                                                 auVar89._4_4_,
                                                                                 auVar89._0_4_ +
                                                                                 auVar89._0_4_)))),
                                           auVar30);
                uVar21 = vcmpps_avx512vl(local_400,auVar108,6);
                uVar73 = uVar73 & uVar21;
                bVar72 = (byte)uVar73;
                if (bVar72 != 0) {
                  auVar162._0_4_ = auVar103._0_4_ * fVar164;
                  auVar162._4_4_ = auVar103._4_4_ * fVar208;
                  auVar162._8_4_ = auVar103._8_4_ * fVar210;
                  auVar162._12_4_ = auVar103._12_4_ * fVar211;
                  auVar162._16_4_ = auVar103._16_4_ * 0.0;
                  auVar162._20_4_ = auVar103._20_4_ * 0.0;
                  auVar162._24_4_ = auVar103._24_4_ * 0.0;
                  auVar162._28_4_ = 0;
                  auVar185._8_4_ = 0x3f800000;
                  auVar185._0_8_ = 0x3f8000003f800000;
                  auVar185._12_4_ = 0x3f800000;
                  auVar185._16_4_ = 0x3f800000;
                  auVar185._20_4_ = 0x3f800000;
                  auVar185._24_4_ = 0x3f800000;
                  auVar185._28_4_ = 0x3f800000;
                  auVar108 = vsubps_avx(auVar185,auVar162);
                  auVar134._0_4_ =
                       (uint)(bVar63 & 1) * (int)auVar162._0_4_ |
                       (uint)!(bool)(bVar63 & 1) * auVar108._0_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
                  auVar134._4_4_ =
                       (uint)bVar12 * (int)auVar162._4_4_ | (uint)!bVar12 * auVar108._4_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
                  auVar134._8_4_ =
                       (uint)bVar12 * (int)auVar162._8_4_ | (uint)!bVar12 * auVar108._8_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
                  auVar134._12_4_ =
                       (uint)bVar12 * (int)auVar162._12_4_ | (uint)!bVar12 * auVar108._12_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
                  auVar134._16_4_ =
                       (uint)bVar12 * (int)auVar162._16_4_ | (uint)!bVar12 * auVar108._16_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
                  auVar134._20_4_ =
                       (uint)bVar12 * (int)auVar162._20_4_ | (uint)!bVar12 * auVar108._20_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
                  auVar134._24_4_ =
                       (uint)bVar12 * (int)auVar162._24_4_ | (uint)!bVar12 * auVar108._24_4_;
                  auVar134._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar108._28_4_;
                  auVar31._8_4_ = 0x40000000;
                  auVar31._0_8_ = 0x4000000040000000;
                  auVar31._12_4_ = 0x40000000;
                  auVar31._16_4_ = 0x40000000;
                  auVar31._20_4_ = 0x40000000;
                  auVar31._24_4_ = 0x40000000;
                  auVar31._28_4_ = 0x40000000;
                  local_420 = vfmsub132ps_avx512vl(auVar134,auVar185,auVar31);
                  local_3e0 = (undefined4)lVar67;
                  local_3d0 = local_680;
                  uStack_3c8 = uStack_678;
                  local_3c0 = local_6a0;
                  uStack_3b8 = uStack_698;
                  local_3b0 = local_6b0;
                  uStack_3a8 = uStack_6a8;
                  local_3a0 = local_690;
                  uStack_398 = uStack_688;
                  pGVar68 = (context->scene->geometries).items[uVar6].ptr;
                  if ((pGVar68->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    uVar71 = (uint)uVar73;
                    auVar89 = vcvtsi2ss_avx512f(auVar97,local_3e0);
                    fVar164 = auVar89._0_4_;
                    local_380[0] = (fVar164 + local_440._0_4_ + 0.0) * local_100;
                    local_380[1] = (fVar164 + local_440._4_4_ + 1.0) * fStack_fc;
                    local_380[2] = (fVar164 + local_440._8_4_ + 2.0) * fStack_f8;
                    local_380[3] = (fVar164 + local_440._12_4_ + 3.0) * fStack_f4;
                    fStack_370 = (fVar164 + local_440._16_4_ + 4.0) * fStack_f0;
                    fStack_36c = (fVar164 + local_440._20_4_ + 5.0) * fStack_ec;
                    fStack_368 = (fVar164 + local_440._24_4_ + 6.0) * fStack_e8;
                    fStack_364 = fVar164 + local_440._28_4_ + 7.0;
                    local_360 = local_420;
                    local_340 = local_400;
                    auVar153._8_4_ = 0x7f800000;
                    auVar153._0_8_ = 0x7f8000007f800000;
                    auVar153._12_4_ = 0x7f800000;
                    auVar153._16_4_ = 0x7f800000;
                    auVar153._20_4_ = 0x7f800000;
                    auVar153._24_4_ = 0x7f800000;
                    auVar153._28_4_ = 0x7f800000;
                    auVar108 = vblendmps_avx512vl(auVar153,local_400);
                    auVar135._0_4_ =
                         (uint)(bVar72 & 1) * auVar108._0_4_ |
                         (uint)!(bool)(bVar72 & 1) * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                    auVar135._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                    auVar135._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
                    auVar135._12_4_ = (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
                    auVar135._16_4_ = (uint)bVar12 * auVar108._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
                    auVar135._20_4_ = (uint)bVar12 * auVar108._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
                    auVar135._24_4_ = (uint)bVar12 * auVar108._24_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = SUB81(uVar73 >> 7,0);
                    auVar135._28_4_ = (uint)bVar12 * auVar108._28_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar108 = vshufps_avx(auVar135,auVar135,0xb1);
                    auVar108 = vminps_avx(auVar135,auVar108);
                    auVar110 = vshufpd_avx(auVar108,auVar108,5);
                    auVar108 = vminps_avx(auVar108,auVar110);
                    auVar110 = vpermpd_avx2(auVar108,0x4e);
                    auVar108 = vminps_avx(auVar108,auVar110);
                    uVar159 = vcmpps_avx512vl(auVar135,auVar108,0);
                    if ((bVar72 & (byte)uVar159) != 0) {
                      uVar71 = (uint)(bVar72 & (byte)uVar159);
                    }
                    uVar65 = 0;
                    for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                      uVar65 = uVar65 + 1;
                    }
                    uVar64 = (ulong)uVar65;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar68->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_640 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                      local_628 = pGVar68;
                      local_5d8 = lVar69;
                      local_5c0 = local_400;
                      local_3dc = iVar7;
                      do {
                        local_1c0 = local_380[uVar64];
                        local_1a0 = *(undefined4 *)(local_360 + uVar64 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_340 + uVar64 * 4);
                        local_670.context = context->user;
                        fVar208 = 1.0 - local_1c0;
                        fVar164 = fVar208 * fVar208 * -3.0;
                        auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * fVar208)),
                                                  ZEXT416((uint)(local_1c0 * fVar208)),
                                                  ZEXT416(0xc0000000));
                        auVar92 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar208)),
                                                  ZEXT416((uint)(local_1c0 * local_1c0)),
                                                  ZEXT416(0x40000000));
                        fVar208 = auVar89._0_4_ * 3.0;
                        fVar210 = auVar92._0_4_ * 3.0;
                        fVar211 = local_1c0 * local_1c0 * 3.0;
                        auVar197._0_4_ = fVar211 * fVar20;
                        auVar197._4_4_ = fVar211 * fVar54;
                        auVar197._8_4_ = fVar211 * fVar55;
                        auVar197._12_4_ = fVar211 * fVar62;
                        auVar146._4_4_ = fVar210;
                        auVar146._0_4_ = fVar210;
                        auVar146._8_4_ = fVar210;
                        auVar146._12_4_ = fVar210;
                        auVar89 = vfmadd132ps_fma(auVar146,auVar197,auVar88);
                        auVar181._4_4_ = fVar208;
                        auVar181._0_4_ = fVar208;
                        auVar181._8_4_ = fVar208;
                        auVar181._12_4_ = fVar208;
                        auVar89 = vfmadd132ps_fma(auVar181,auVar89,auVar87);
                        auVar147._4_4_ = fVar164;
                        auVar147._0_4_ = fVar164;
                        auVar147._8_4_ = fVar164;
                        auVar147._12_4_ = fVar164;
                        auVar89 = vfmadd132ps_fma(auVar147,auVar89,auVar90);
                        local_220 = auVar89._0_4_;
                        auVar192._8_4_ = 1;
                        auVar192._0_8_ = 0x100000001;
                        auVar192._12_4_ = 1;
                        auVar192._16_4_ = 1;
                        auVar192._20_4_ = 1;
                        auVar192._24_4_ = 1;
                        auVar192._28_4_ = 1;
                        local_200 = vpermps_avx2(auVar192,ZEXT1632(auVar89));
                        auVar194 = ZEXT3264(local_200);
                        auVar198._8_4_ = 2;
                        auVar198._0_8_ = 0x200000002;
                        auVar198._12_4_ = 2;
                        auVar201._16_4_ = 2;
                        auVar201._0_16_ = auVar198;
                        auVar201._20_4_ = 2;
                        auVar201._24_4_ = 2;
                        auVar201._28_4_ = 2;
                        auVar203 = ZEXT3264(auVar201);
                        local_1e0 = vpermps_avx2(auVar201,ZEXT1632(auVar89));
                        iStack_21c = local_220;
                        iStack_218 = local_220;
                        iStack_214 = local_220;
                        iStack_210 = local_220;
                        iStack_20c = local_220;
                        iStack_208 = local_220;
                        iStack_204 = local_220;
                        fStack_1bc = local_1c0;
                        fStack_1b8 = local_1c0;
                        fStack_1b4 = local_1c0;
                        fStack_1b0 = local_1c0;
                        fStack_1ac = local_1c0;
                        fStack_1a8 = local_1c0;
                        fStack_1a4 = local_1c0;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_2e0._0_8_;
                        uStack_178 = local_2e0._8_8_;
                        uStack_170 = local_2e0._16_8_;
                        uStack_168 = local_2e0._24_8_;
                        local_160 = local_2c0;
                        auVar108 = vpcmpeqd_avx2(local_2c0,local_2c0);
                        local_618[1] = auVar108;
                        *local_618 = auVar108;
                        local_140 = (local_670.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_670.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_600 = local_300;
                        local_670.valid = (int *)local_600;
                        local_670.geometryUserPtr = pGVar68->userPtr;
                        local_670.hit = (RTCHitN *)&local_220;
                        local_670.N = 8;
                        local_670.ray = (RTCRayN *)ray;
                        if (pGVar68->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar194 = ZEXT1664(local_200._0_16_);
                          auVar203 = ZEXT1664(auVar198);
                          (*pGVar68->intersectionFilterN)(&local_670);
                          auVar206 = ZEXT3264(local_5c0);
                          pGVar68 = local_628;
                        }
                        if (local_600 == (undefined1  [32])0x0) {
LAB_019223b5:
                          *(undefined4 *)(ray + k * 4 + 0x100) = local_640._0_4_;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar68->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar194 = ZEXT1664(auVar194._0_16_);
                            auVar203 = ZEXT1664(auVar203._0_16_);
                            (*p_Var11)(&local_670);
                            auVar206 = ZEXT3264(local_5c0);
                            pGVar68 = local_628;
                          }
                          if (local_600 == (undefined1  [32])0x0) goto LAB_019223b5;
                          uVar21 = vptestmd_avx512vl(local_600,local_600);
                          iVar1 = *(int *)(local_670.hit + 4);
                          iVar2 = *(int *)(local_670.hit + 8);
                          iVar56 = *(int *)(local_670.hit + 0xc);
                          iVar57 = *(int *)(local_670.hit + 0x10);
                          iVar58 = *(int *)(local_670.hit + 0x14);
                          iVar59 = *(int *)(local_670.hit + 0x18);
                          iVar60 = *(int *)(local_670.hit + 0x1c);
                          bVar72 = (byte)uVar21;
                          bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
                          bVar18 = SUB81(uVar21 >> 7,0);
                          *(uint *)(local_670.ray + 0x180) =
                               (uint)(bVar72 & 1) * *(int *)local_670.hit |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_670.ray + 0x180);
                          *(uint *)(local_670.ray + 0x184) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_670.ray + 0x184);
                          *(uint *)(local_670.ray + 0x188) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x188);
                          *(uint *)(local_670.ray + 0x18c) =
                               (uint)bVar14 * iVar56 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x18c);
                          *(uint *)(local_670.ray + 400) =
                               (uint)bVar15 * iVar57 | (uint)!bVar15 * *(int *)(local_670.ray + 400)
                          ;
                          *(uint *)(local_670.ray + 0x194) =
                               (uint)bVar16 * iVar58 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x194);
                          *(uint *)(local_670.ray + 0x198) =
                               (uint)bVar17 * iVar59 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x198);
                          *(uint *)(local_670.ray + 0x19c) =
                               (uint)bVar18 * iVar60 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x19c);
                          iVar1 = *(int *)(local_670.hit + 0x24);
                          iVar2 = *(int *)(local_670.hit + 0x28);
                          iVar56 = *(int *)(local_670.hit + 0x2c);
                          iVar57 = *(int *)(local_670.hit + 0x30);
                          iVar58 = *(int *)(local_670.hit + 0x34);
                          iVar59 = *(int *)(local_670.hit + 0x38);
                          iVar60 = *(int *)(local_670.hit + 0x3c);
                          bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
                          bVar18 = SUB81(uVar21 >> 7,0);
                          *(uint *)(local_670.ray + 0x1a0) =
                               (uint)(bVar72 & 1) * *(int *)(local_670.hit + 0x20) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_670.ray + 0x1a0);
                          *(uint *)(local_670.ray + 0x1a4) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_670.ray + 0x1a4);
                          *(uint *)(local_670.ray + 0x1a8) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x1a8);
                          *(uint *)(local_670.ray + 0x1ac) =
                               (uint)bVar14 * iVar56 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x1ac);
                          *(uint *)(local_670.ray + 0x1b0) =
                               (uint)bVar15 * iVar57 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x1b0);
                          *(uint *)(local_670.ray + 0x1b4) =
                               (uint)bVar16 * iVar58 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x1b4);
                          *(uint *)(local_670.ray + 0x1b8) =
                               (uint)bVar17 * iVar59 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x1b8);
                          *(uint *)(local_670.ray + 0x1bc) =
                               (uint)bVar18 * iVar60 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1bc);
                          iVar1 = *(int *)(local_670.hit + 0x44);
                          iVar2 = *(int *)(local_670.hit + 0x48);
                          iVar56 = *(int *)(local_670.hit + 0x4c);
                          iVar57 = *(int *)(local_670.hit + 0x50);
                          iVar58 = *(int *)(local_670.hit + 0x54);
                          iVar59 = *(int *)(local_670.hit + 0x58);
                          iVar60 = *(int *)(local_670.hit + 0x5c);
                          bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
                          bVar18 = SUB81(uVar21 >> 7,0);
                          *(uint *)(local_670.ray + 0x1c0) =
                               (uint)(bVar72 & 1) * *(int *)(local_670.hit + 0x40) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_670.ray + 0x1c0);
                          *(uint *)(local_670.ray + 0x1c4) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_670.ray + 0x1c4);
                          *(uint *)(local_670.ray + 0x1c8) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x1c8);
                          *(uint *)(local_670.ray + 0x1cc) =
                               (uint)bVar14 * iVar56 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x1cc);
                          *(uint *)(local_670.ray + 0x1d0) =
                               (uint)bVar15 * iVar57 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x1d0);
                          *(uint *)(local_670.ray + 0x1d4) =
                               (uint)bVar16 * iVar58 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x1d4);
                          *(uint *)(local_670.ray + 0x1d8) =
                               (uint)bVar17 * iVar59 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x1d8);
                          *(uint *)(local_670.ray + 0x1dc) =
                               (uint)bVar18 * iVar60 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1dc);
                          iVar1 = *(int *)(local_670.hit + 100);
                          iVar2 = *(int *)(local_670.hit + 0x68);
                          iVar56 = *(int *)(local_670.hit + 0x6c);
                          iVar57 = *(int *)(local_670.hit + 0x70);
                          iVar58 = *(int *)(local_670.hit + 0x74);
                          iVar59 = *(int *)(local_670.hit + 0x78);
                          iVar60 = *(int *)(local_670.hit + 0x7c);
                          bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
                          bVar18 = SUB81(uVar21 >> 7,0);
                          *(uint *)(local_670.ray + 0x1e0) =
                               (uint)(bVar72 & 1) * *(int *)(local_670.hit + 0x60) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_670.ray + 0x1e0);
                          *(uint *)(local_670.ray + 0x1e4) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_670.ray + 0x1e4);
                          *(uint *)(local_670.ray + 0x1e8) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x1e8);
                          *(uint *)(local_670.ray + 0x1ec) =
                               (uint)bVar14 * iVar56 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x1ec);
                          *(uint *)(local_670.ray + 0x1f0) =
                               (uint)bVar15 * iVar57 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x1f0);
                          *(uint *)(local_670.ray + 500) =
                               (uint)bVar16 * iVar58 | (uint)!bVar16 * *(int *)(local_670.ray + 500)
                          ;
                          *(uint *)(local_670.ray + 0x1f8) =
                               (uint)bVar17 * iVar59 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x1f8);
                          *(uint *)(local_670.ray + 0x1fc) =
                               (uint)bVar18 * iVar60 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1fc);
                          iVar1 = *(int *)(local_670.hit + 0x84);
                          iVar2 = *(int *)(local_670.hit + 0x88);
                          iVar56 = *(int *)(local_670.hit + 0x8c);
                          iVar57 = *(int *)(local_670.hit + 0x90);
                          iVar58 = *(int *)(local_670.hit + 0x94);
                          iVar59 = *(int *)(local_670.hit + 0x98);
                          iVar60 = *(int *)(local_670.hit + 0x9c);
                          bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
                          bVar18 = SUB81(uVar21 >> 7,0);
                          *(uint *)(local_670.ray + 0x200) =
                               (uint)(bVar72 & 1) * *(int *)(local_670.hit + 0x80) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_670.ray + 0x200);
                          *(uint *)(local_670.ray + 0x204) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_670.ray + 0x204);
                          *(uint *)(local_670.ray + 0x208) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x208);
                          *(uint *)(local_670.ray + 0x20c) =
                               (uint)bVar14 * iVar56 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x20c);
                          *(uint *)(local_670.ray + 0x210) =
                               (uint)bVar15 * iVar57 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x210);
                          *(uint *)(local_670.ray + 0x214) =
                               (uint)bVar16 * iVar58 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x214);
                          *(uint *)(local_670.ray + 0x218) =
                               (uint)bVar17 * iVar59 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x218);
                          *(uint *)(local_670.ray + 0x21c) =
                               (uint)bVar18 * iVar60 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x21c);
                          auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x220) = auVar108;
                          auVar108 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x240) = auVar108;
                          auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x260) = auVar108;
                          auVar108 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_670.hit + 0x100));
                          *(undefined1 (*) [32])(local_670.ray + 0x280) = auVar108;
                          local_640._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                          local_640._4_4_ = 0;
                          local_640._8_4_ = 0;
                          local_640._12_4_ = 0;
                        }
                        bVar72 = ~(byte)(1 << ((uint)uVar64 & 0x1f)) & (byte)uVar73;
                        auVar154._4_4_ = local_640._0_4_;
                        auVar154._0_4_ = local_640._0_4_;
                        auVar154._8_4_ = local_640._0_4_;
                        auVar154._12_4_ = local_640._0_4_;
                        auVar154._16_4_ = local_640._0_4_;
                        auVar154._20_4_ = local_640._0_4_;
                        auVar154._24_4_ = local_640._0_4_;
                        auVar154._28_4_ = local_640._0_4_;
                        uVar159 = vcmpps_avx512vl(auVar206._0_32_,auVar154,2);
                        if ((bVar72 & (byte)uVar159) == 0) goto LAB_0192245a;
                        bVar72 = bVar72 & (byte)uVar159;
                        uVar71 = (uint)bVar72;
                        uVar73 = (ulong)uVar71;
                        auVar155._8_4_ = 0x7f800000;
                        auVar155._0_8_ = 0x7f8000007f800000;
                        auVar155._12_4_ = 0x7f800000;
                        auVar155._16_4_ = 0x7f800000;
                        auVar155._20_4_ = 0x7f800000;
                        auVar155._24_4_ = 0x7f800000;
                        auVar155._28_4_ = 0x7f800000;
                        auVar108 = vblendmps_avx512vl(auVar155,auVar206._0_32_);
                        auVar136._0_4_ =
                             (uint)(bVar72 & 1) * auVar108._0_4_ |
                             (uint)!(bool)(bVar72 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar72 >> 1 & 1);
                        auVar136._4_4_ = (uint)bVar12 * auVar108._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar72 >> 2 & 1);
                        auVar136._8_4_ = (uint)bVar12 * auVar108._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar72 >> 3 & 1);
                        auVar136._12_4_ =
                             (uint)bVar12 * auVar108._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar72 >> 4 & 1);
                        auVar136._16_4_ =
                             (uint)bVar12 * auVar108._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar72 >> 5 & 1);
                        auVar136._20_4_ =
                             (uint)bVar12 * auVar108._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar72 >> 6 & 1);
                        auVar136._24_4_ =
                             (uint)bVar12 * auVar108._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar136._28_4_ =
                             (uint)(bVar72 >> 7) * auVar108._28_4_ |
                             (uint)!(bool)(bVar72 >> 7) * 0x7f800000;
                        auVar108 = vshufps_avx(auVar136,auVar136,0xb1);
                        auVar108 = vminps_avx(auVar136,auVar108);
                        auVar110 = vshufpd_avx(auVar108,auVar108,5);
                        auVar108 = vminps_avx(auVar108,auVar110);
                        auVar110 = vpermpd_avx2(auVar108,0x4e);
                        auVar108 = vminps_avx(auVar108,auVar110);
                        uVar159 = vcmpps_avx512vl(auVar136,auVar108,0);
                        bVar72 = (byte)uVar159 & bVar72;
                        if (bVar72 != 0) {
                          uVar71 = (uint)bVar72;
                        }
                        uVar65 = 0;
                        for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                          uVar65 = uVar65 + 1;
                        }
                        uVar64 = (ulong)uVar65;
                      } while( true );
                    }
                    fVar164 = local_380[uVar64];
                    uVar158 = *(undefined4 *)(local_360 + uVar64 * 4);
                    fVar210 = 1.0 - fVar164;
                    fVar208 = fVar210 * fVar210 * -3.0;
                    auVar194 = ZEXT464((uint)fVar208);
                    auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * fVar210)),
                                              ZEXT416((uint)(fVar164 * fVar210)),ZEXT416(0xc0000000)
                                             );
                    auVar92 = vfmsub132ss_fma(ZEXT416((uint)(fVar164 * fVar210)),
                                              ZEXT416((uint)(fVar164 * fVar164)),ZEXT416(0x40000000)
                                             );
                    fVar210 = auVar89._0_4_ * 3.0;
                    fVar211 = auVar92._0_4_ * 3.0;
                    fVar173 = fVar164 * fVar164 * 3.0;
                    auVar196._0_4_ = fVar173 * fVar20;
                    auVar196._4_4_ = fVar173 * fVar54;
                    auVar196._8_4_ = fVar173 * fVar55;
                    auVar196._12_4_ = fVar173 * fVar62;
                    auVar203 = ZEXT1664(auVar196);
                    auVar168._4_4_ = fVar211;
                    auVar168._0_4_ = fVar211;
                    auVar168._8_4_ = fVar211;
                    auVar168._12_4_ = fVar211;
                    auVar89 = vfmadd132ps_fma(auVar168,auVar196,auVar88);
                    auVar180._4_4_ = fVar210;
                    auVar180._0_4_ = fVar210;
                    auVar180._8_4_ = fVar210;
                    auVar180._12_4_ = fVar210;
                    auVar89 = vfmadd132ps_fma(auVar180,auVar89,auVar87);
                    auVar169._4_4_ = fVar208;
                    auVar169._0_4_ = fVar208;
                    auVar169._8_4_ = fVar208;
                    auVar169._12_4_ = fVar208;
                    auVar89 = vfmadd132ps_fma(auVar169,auVar89,auVar90);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar64 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar89._0_4_;
                    uVar8 = vextractps_avx(auVar89,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                    uVar8 = vextractps_avx(auVar89,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar8;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar164;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar158;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_608;
                    *(uint *)(ray + k * 4 + 0x240) = uVar6;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_019220a7;
      }
    }
    uVar158 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar24._4_4_ = uVar158;
    auVar24._0_4_ = uVar158;
    auVar24._8_4_ = uVar158;
    auVar24._12_4_ = uVar158;
    uVar159 = vcmpps_avx512vl(local_310,auVar24,2);
    local_5c8 = (ulong)((uint)local_5c8 & (uint)local_5c8 + 0xf & (uint)uVar159);
  } while( true );
LAB_0192245a:
  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar227 = ZEXT1664(auVar89);
  auVar89 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
  auVar228 = ZEXT1664(auVar89);
  lVar69 = local_5d8;
LAB_019220a7:
  lVar67 = lVar67 + 8;
  goto LAB_019217ee;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }